

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::anon_unknown_133::
     genericCheckTestMessage<capnproto_test::capnp::test::TestAllTypes::Reader>(Reader reader)

{
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Reader reader_03;
  Reader reader_04;
  Reader reader_05;
  Reader reader_06;
  Reader reader_07;
  Reader reader_08;
  Reader reader_09;
  Reader reader_10;
  Reader reader_11;
  Reader reader_12;
  Reader reader_13;
  Reader reader_14;
  Reader reader_15;
  Reader reader_16;
  Reader reader_17;
  Reader reader_18;
  Reader reader_19;
  Reader reader_20;
  Reader reader_21;
  Reader reader_22;
  Reader reader_23;
  Reader reader_24;
  Reader reader_25;
  Reader reader_26;
  ArrayPtr<const_char> AVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  byte bVar4;
  undefined1 uVar5;
  unsigned_short uVar6;
  undefined2 uVar7;
  char *pcVar8;
  WirePointer WVar9;
  WirePointer WVar10;
  bool result;
  char cVar11;
  short sVar12;
  int iVar13;
  undefined4 uVar14;
  uint32_t uVar15;
  bool result_1;
  CapTableReader *pCVar16;
  bool bVar17;
  float fVar18;
  uint uVar19;
  WireValue<uint32_t> WVar20;
  undefined4 uVar21;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar22;
  float fVar23;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar24;
  float fVar25;
  double dVar26;
  double dVar27;
  initializer_list<capnp::Void> expected;
  initializer_list<bool> expected_00;
  initializer_list<signed_char> expected_01;
  initializer_list<short> expected_02;
  initializer_list<int> expected_03;
  initializer_list<long> expected_04;
  initializer_list<unsigned_char> expected_05;
  initializer_list<unsigned_short> expected_06;
  initializer_list<unsigned_int> expected_07;
  initializer_list<unsigned_long> expected_08;
  initializer_list<float> expected_09;
  initializer_list<double> expected_10;
  initializer_list<capnp::Text::Reader> expected_11;
  initializer_list<capnp::Data::Reader> expected_12;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected_13;
  initializer_list<bool> expected_14;
  initializer_list<signed_char> expected_15;
  initializer_list<short> expected_16;
  initializer_list<int> expected_17;
  initializer_list<long> expected_18;
  initializer_list<unsigned_char> expected_19;
  initializer_list<unsigned_short> expected_20;
  initializer_list<unsigned_int> expected_21;
  initializer_list<unsigned_long> expected_22;
  initializer_list<capnp::Text::Reader> expected_23;
  initializer_list<capnp::Data::Reader> expected_24;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected_25;
  SegmentReader *in_stack_00000008;
  CapTableReader *in_stack_00000010;
  byte *in_stack_00000018;
  WirePointer *in_stack_00000020;
  uint in_stack_00000028;
  ushort in_stack_0000002c;
  Reader subReader;
  DebugComparison<bool,_bool> _kjCondition;
  DebugExpression<bool> _kjCondition_9;
  DebugExpression<bool> _kjCondition_21;
  undefined1 local_638 [8];
  WirePointer local_630;
  WirePointer *local_628;
  WirePointer *local_620;
  uint local_618;
  ushort local_614;
  int local_610;
  undefined1 local_608 [2];
  unsigned_short uStack_606;
  uint32_t uStack_604;
  WirePointer WStack_600;
  undefined1 local_5f8 [8];
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  size_t sStack_5e0;
  bool local_5d8;
  undefined1 local_5c8 [24];
  int local_5b0;
  undefined4 uStack_5ac;
  StructPointerCount local_5a4;
  int local_5a0;
  StructReader local_598;
  char *local_568;
  PointerReader local_560;
  ListReader local_540;
  ListReader local_510;
  ListReader local_4e0;
  ListReader local_4b0;
  ListReader local_480;
  ListReader local_450;
  ListReader local_420;
  ListReader local_3f0;
  ListReader local_3c0;
  ListReader local_390;
  ListReader local_360;
  ListReader local_330;
  ListReader local_300;
  ListReader local_2d0;
  ListReader local_2a0;
  ListReader local_270;
  ListReader local_240;
  ListReader local_210;
  ListReader local_1e0;
  ListReader local_1b0;
  ListReader local_180;
  ListReader local_150;
  ListReader local_120;
  ListReader local_f0;
  ListReader local_c0;
  ListReader local_90;
  ListReader local_60;
  
  local_560.capTable = (CapTableReader *)local_560.segment;
  if (in_stack_00000028 == 0) {
    bVar17 = false;
  }
  else {
    bVar17 = (bool)(*in_stack_00000018 & 1);
  }
  local_608 = (undefined1  [2])CONCAT11(bVar17,true);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._1_7_ = local_5f8._1_7_;
  uStack_5f0._0_1_ = bVar17;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((bVar17 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_638[0] = 1;
    if (in_stack_00000028 == 0) {
      bVar4 = 0;
    }
    else {
      bVar4 = *in_stack_00000018 & 1;
    }
    local_5c8[0] = (bool)bVar4;
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xdc,ERROR,
               "\"failed: expected \" \"(true) == (reader.getBoolField())\", _kjCondition, true, reader.getBoolField()"
               ,(char (*) [51])"failed: expected (true) == (reader.getBoolField())",
               (DebugComparison<bool,_bool> *)local_608,(bool *)local_638,(bool *)local_5c8);
  }
  if (in_stack_00000028 < 0x10) {
    bVar4 = 0;
  }
  else {
    bVar4 = in_stack_00000018[1];
  }
  _local_608 = CONCAT14(bVar4,0xffffff85);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = bVar4 == 0x85;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((bVar4 != 0x85) && (kj::_::Debug::minSeverity < 3)) {
    local_638._0_4_ = 0xffffff85;
    if (in_stack_00000028 < 0x10) {
      bVar4 = 0;
    }
    else {
      bVar4 = in_stack_00000018[1];
    }
    local_5c8[0] = (bool)bVar4;
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xdd,ERROR,
               "\"failed: expected \" \"(-123) == (reader.getInt8Field())\", _kjCondition, -123, reader.getInt8Field()"
               ,(char (*) [51])"failed: expected (-123) == (reader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)local_608,(int *)local_638,local_5c8);
  }
  if (in_stack_00000028 < 0x20) {
    sVar12 = 0;
  }
  else {
    sVar12 = *(short *)(in_stack_00000018 + 2);
  }
  _local_608 = CONCAT24(sVar12,0xffffcfc7);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = sVar12 == -0x3039;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((sVar12 != -0x3039) && (kj::_::Debug::minSeverity < 3)) {
    local_638._0_4_ = 0xffffcfc7;
    if (in_stack_00000028 < 0x20) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined2 *)(in_stack_00000018 + 2);
    }
    local_5c8._0_2_ = uVar7;
    kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xde,ERROR,
               "\"failed: expected \" \"(-12345) == (reader.getInt16Field())\", _kjCondition, -12345, reader.getInt16Field()"
               ,(char (*) [54])"failed: expected (-12345) == (reader.getInt16Field())",
               (DebugComparison<int,_short> *)local_608,(int *)local_638,(short *)local_5c8);
  }
  iVar13 = 0;
  if (0x3f < in_stack_00000028) {
    iVar13 = *(int *)(in_stack_00000018 + 4);
  }
  _local_608 = (char *)CONCAT44(iVar13,0xff439eb2);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = iVar13 == -0xbc614e;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((iVar13 != -0xbc614e) && (kj::_::Debug::minSeverity < 3)) {
    uVar14 = 0;
    local_638._0_4_ = 0xff439eb2;
    if (0x3f < in_stack_00000028) {
      uVar14 = *(undefined4 *)(in_stack_00000018 + 4);
    }
    local_5c8._0_4_ = uVar14;
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(-12345678) == (reader.getInt32Field())\", _kjCondition, -12345678, reader.getInt32Field()"
               ,(char (*) [57])"failed: expected (-12345678) == (reader.getInt32Field())",
               (DebugComparison<int,_int> *)local_608,(int *)local_638,(int *)local_5c8);
  }
  if (in_stack_00000028 < 0x80) {
    WStack_600 = (WirePointer)0x0;
  }
  else {
    WStack_600 = *(WirePointer *)(in_stack_00000018 + 8);
  }
  _local_608 = (char *)0xffff8fb779f22087;
  local_5f8 = (undefined1  [8])0x299598;
  uStack_5f0 = (WirePointer *)&DAT_00000005;
  local_5e8 = (char *)CONCAT71(local_5e8._1_7_,WStack_600 == (WirePointer)0xffff8fb779f22087);
  pWVar2 = (WirePointer *)0x0;
  if ((WStack_600 != (WirePointer)0xffff8fb779f22087) && (kj::_::Debug::minSeverity < 3)) {
    local_638 = (undefined1  [8])0xffff8fb779f22087;
    if (in_stack_00000028 < 0x80) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = *(char **)(in_stack_00000018 + 8);
    }
    local_5c8._0_8_ = pcVar8;
    kj::_::Debug::log<char_const(&)[66],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe0,ERROR,
               "\"failed: expected \" \"(-123456789012345ll) == (reader.getInt64Field())\", _kjCondition, -123456789012345ll, reader.getInt64Field()"
               ,(char (*) [66])"failed: expected (-123456789012345ll) == (reader.getInt64Field())",
               (DebugComparison<long_long,_long> *)local_608,(longlong *)local_638,(long *)local_5c8
              );
    pWVar2 = uStack_5f0;
  }
  uStack_5f0 = pWVar2;
  if (in_stack_00000028 < 0x88) {
    bVar4 = 0;
  }
  else {
    bVar4 = in_stack_00000018[0x10];
  }
  _local_608 = CONCAT14(bVar4,0xea);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = bVar4 == 0xea;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((bVar4 != 0xea) && (kj::_::Debug::minSeverity < 3)) {
    local_638._0_4_ = 0xea;
    if (in_stack_00000028 < 0x88) {
      bVar4 = 0;
    }
    else {
      bVar4 = in_stack_00000018[0x10];
    }
    local_5c8[0] = (bool)bVar4;
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"(234u) == (reader.getUInt8Field())\", _kjCondition, 234u, reader.getUInt8Field()"
               ,(char (*) [52])"failed: expected (234u) == (reader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)local_608,(uint *)local_638,local_5c8
              );
  }
  if (in_stack_00000028 < 0xa0) {
    sVar12 = 0;
  }
  else {
    sVar12 = *(short *)(in_stack_00000018 + 0x12);
  }
  _local_608 = CONCAT24(sVar12,0xb26e);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = sVar12 == -0x4d92;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((sVar12 != -0x4d92) && (kj::_::Debug::minSeverity < 3)) {
    local_638._0_4_ = 0xb26e;
    if (in_stack_00000028 < 0xa0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined2 *)(in_stack_00000018 + 0x12);
    }
    local_5c8._0_2_ = uVar7;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe2,ERROR,
               "\"failed: expected \" \"(45678u) == (reader.getUInt16Field())\", _kjCondition, 45678u, reader.getUInt16Field()"
               ,(char (*) [55])"failed: expected (45678u) == (reader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)local_608,(uint *)local_638,
               (unsigned_short *)local_5c8);
  }
  iVar13 = 0;
  if (0xbf < in_stack_00000028) {
    iVar13 = *(int *)(in_stack_00000018 + 0x14);
  }
  _local_608 = (char *)CONCAT44(iVar13,0xce0a6a14);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = iVar13 == -0x31f595ec;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((iVar13 != -0x31f595ec) && (kj::_::Debug::minSeverity < 3)) {
    uVar14 = 0;
    local_638._0_4_ = 0xce0a6a14;
    if (0xbf < in_stack_00000028) {
      uVar14 = *(undefined4 *)(in_stack_00000018 + 0x14);
    }
    local_5c8._0_4_ = uVar14;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe3,ERROR,
               "\"failed: expected \" \"(3456789012u) == (reader.getUInt32Field())\", _kjCondition, 3456789012u, reader.getUInt32Field()"
               ,(char (*) [60])"failed: expected (3456789012u) == (reader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_608,(uint *)local_638,
               (uint *)local_5c8);
  }
  if (in_stack_00000028 < 0x100) {
    WStack_600 = (WirePointer)0x0;
  }
  else {
    WStack_600 = *(WirePointer *)(in_stack_00000018 + 0x18);
  }
  _local_608 = (char *)0xab54a98ceb1f0ad2;
  uStack_5f0 = (WirePointer *)0x5;
  local_5f8 = (undefined1  [8])" == ";
  local_5e8 = (char *)CONCAT71(local_5e8._1_7_,WStack_600 == (WirePointer)0xab54a98ceb1f0ad2);
  if ((WStack_600 != (WirePointer)0xab54a98ceb1f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    local_638 = (undefined1  [8])0xab54a98ceb1f0ad2;
    if (in_stack_00000028 < 0x100) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = *(char **)(in_stack_00000018 + 0x18);
    }
    local_5c8._0_8_ = pcVar8;
    kj::_::Debug::
    log<char_const(&)[72],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe4,ERROR,
               "\"failed: expected \" \"(12345678901234567890ull) == (reader.getUInt64Field())\", _kjCondition, 12345678901234567890ull, reader.getUInt64Field()"
               ,(char (*) [72])
                "failed: expected (12345678901234567890ull) == (reader.getUInt64Field())",
               (DebugComparison<unsigned_long_long,_unsigned_long> *)local_608,
               (unsigned_long_long *)local_638,(unsigned_long *)local_5c8);
  }
  fVar18 = 0.0;
  if (0x11f < in_stack_00000028) {
    fVar18 = *(float *)(in_stack_00000018 + 0x20);
  }
  if ((fVar18 != 1234.5) || (NAN(fVar18))) {
    fVar23 = fVar18 + -1234.5;
    fVar25 = -fVar23;
    if (-fVar23 <= fVar23) {
      fVar25 = fVar23;
    }
    fVar23 = -fVar18;
    if (-fVar18 <= fVar18) {
      fVar23 = fVar18;
    }
    fVar18 = (fVar23 + 1234.5) * 1e-05;
    local_5c8[0] = fVar25 < fVar18;
    if ((fVar18 <= fVar25) && (kj::_::Debug::minSeverity < 3)) {
      uVar14 = 0;
      if (0x11f < in_stack_00000028) {
        uVar14 = *(undefined4 *)(in_stack_00000018 + 0x20);
      }
      _local_608 = (char *)CONCAT44(uStack_604,uVar14);
      local_638._0_4_ = 0x449a5000;
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)\", _kjCondition, reader.getFloat32Field(), 1234.5f"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)",
                 (DebugExpression<bool> *)local_5c8,(float *)local_608,(float *)local_638);
    }
  }
  uVar14 = 0;
  uVar21 = 0;
  if (0x17f < in_stack_00000028) {
    uVar14 = (undefined4)*(undefined8 *)(in_stack_00000018 + 0x28);
    uVar21 = (undefined4)((ulong)*(undefined8 *)(in_stack_00000018 + 0x28) >> 0x20);
  }
  uVar3 = local_5c8._8_8_;
  if (((double)CONCAT44(uVar21,uVar14) != -1.23e+47) || (NAN((double)CONCAT44(uVar21,uVar14)))) {
    dVar26 = (double)CONCAT44(uVar21,uVar14) + 1.23e+47;
    dVar27 = -dVar26;
    if (-dVar26 <= dVar26) {
      dVar27 = dVar26;
    }
    dVar26 = -(double)CONCAT44(uVar21,uVar14);
    if (dVar26 <= (double)CONCAT44(uVar21,uVar14)) {
      dVar26 = (double)CONCAT44(uVar21,uVar14);
    }
    dVar26 = (dVar26 + 1.23e+47) * 1e-12;
    local_5c8[0] = dVar27 < dVar26;
    if ((dVar26 <= dVar27) && (kj::_::Debug::minSeverity < 3)) {
      uVar14 = 0;
      uVar21 = 0;
      if (0x17f < in_stack_00000028) {
        uVar14 = (undefined4)*(undefined8 *)(in_stack_00000018 + 0x28);
        uVar21 = (undefined4)((ulong)*(undefined8 *)(in_stack_00000018 + 0x28) >> 0x20);
      }
      _local_608 = (char *)CONCAT44(uVar21,uVar14);
      local_638 = (undefined1  [8])0xc9b58b82c0e0bb00;
      kj::_::Debug::log<char_const(&)[79],kj::_::DebugExpression<bool>&,double,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)\", _kjCondition, reader.getFloat64Field(), -123e45"
                 ,(char (*) [79])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)",
                 (DebugExpression<bool> *)local_5c8,(double *)local_608,(double *)local_638);
      uVar3 = local_5c8._8_8_;
    }
  }
  local_5c8._8_8_ = uVar3;
  local_5c8._0_8_ = "foo";
  WStack_600 = (WirePointer)in_stack_00000010;
  local_5f8 = (undefined1  [8])in_stack_00000020;
  _local_608 = (char *)in_stack_00000008;
  uStack_5f0._0_4_ = (int)subReader._reader.segment;
  if (in_stack_0000002c == 0) {
    WStack_600 = (WirePointer)(CapTableReader *)0x0;
    local_5f8 = (undefined1  [8])(WirePointer *)0x0;
    _local_608 = (char *)(SegmentReader *)0x0;
    uStack_5f0._0_4_ = 0x7fffffff;
  }
  _local_638 = (ArrayPtr<const_char>)
               PointerReader::getBlob<capnp::Text>((PointerReader *)local_608,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_608,
             (DebugExpression<char_const(&)[4]> *)local_5c8,(Reader *)local_638);
  if ((sStack_5e0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    local_630 = (WirePointer)in_stack_00000010;
    local_628 = in_stack_00000020;
    local_638 = (undefined1  [8])in_stack_00000008;
    iVar13 = (int)subReader._reader.segment;
    if (in_stack_0000002c == 0) {
      local_630 = (WirePointer)(CapTableReader *)0x0;
      local_628 = (WirePointer *)0x0;
      local_638 = (undefined1  [8])(SegmentReader *)0x0;
      iVar13 = 0x7fffffff;
    }
    local_620 = (WirePointer *)CONCAT44(local_620._4_4_,iVar13);
    _local_638 = (ArrayPtr<const_char>)
                 PointerReader::getBlob<capnp::Text>((PointerReader *)local_638,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe7,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (reader.getTextField())\", _kjCondition, \"foo\", reader.getTextField()"
               ,(char (*) [52])"failed: expected (\"foo\") == (reader.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_608,
               (char (*) [4])"foo",(Reader *)local_638);
  }
  if (in_stack_0000002c < 2) {
    uStack_5f0._0_4_ = 0x7fffffff;
    WStack_600 = (WirePointer)0x0;
    local_5f8 = (undefined1  [8])0x0;
    _local_608 = (char *)0x0;
  }
  else {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 1);
    WStack_600 = (WirePointer)in_stack_00000010;
    _local_608 = (char *)in_stack_00000008;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  bVar17 = false;
  _local_5f8 = (ArrayPtr<const_unsigned_char>)
               PointerReader::getBlob<capnp::Data>((PointerReader *)local_608,(void *)0x0,0);
  if (uStack_5f0 == (WirePointer *)0x3) {
    bVar17 = (char)*(short *)((long)local_5f8 + 2) == 'r' && *(short *)local_5f8 == 0x6162;
  }
  _local_608 = "bar";
  WStack_600 = (WirePointer)0x3;
  local_5e8 = " == ";
  sStack_5e0 = 5;
  local_5d8 = bVar17;
  if ((bVar17 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._8_8_ = 3;
    local_5c8._0_8_ = "bar";
    if (in_stack_0000002c < 2) {
      iVar13 = 0x7fffffff;
      local_630 = (WirePointer)0x0;
      local_628 = (WirePointer *)0x0;
      local_638 = (undefined1  [8])0x0;
    }
    else {
      local_628 = in_stack_00000020 + 1;
      local_630 = (WirePointer)in_stack_00000010;
      local_638 = (undefined1  [8])in_stack_00000008;
      iVar13 = (int)subReader._reader.segment;
    }
    local_620 = (WirePointer *)CONCAT44(local_620._4_4_,iVar13);
    _local_638 = (ArrayPtr<const_char>)
                 PointerReader::getBlob<capnp::Data>((PointerReader *)local_638,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe8,ERROR,
               "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.getDataField())\", _kjCondition, data(\"bar\"), reader.getDataField()"
               ,(char (*) [58])"failed: expected (data(\"bar\")) == (reader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_608,
               (Reader *)local_5c8,(Reader *)local_638);
  }
  if (in_stack_0000002c < 3) {
    iVar13 = 0x7fffffff;
    WStack_600 = (WirePointer)0x0;
    local_5f8 = (undefined1  [8])0x0;
    _local_608 = (char *)0x0;
  }
  else {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 2);
    WStack_600 = (WirePointer)in_stack_00000010;
    _local_608 = (char *)in_stack_00000008;
    iVar13 = (int)subReader._reader.segment;
  }
  uStack_5f0._0_4_ = iVar13;
  bVar17 = false;
  PointerReader::getStruct((StructReader *)local_638,(PointerReader *)local_608,(word *)0x0);
  if (local_618 != 0) {
    bVar17 = (bool)((byte)(local_628->offsetAndKind).value & 1);
  }
  local_608 = (undefined1  [2])CONCAT11(bVar17,true);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = bVar17;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((bVar17 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8[0] = true;
    if (local_618 == 0) {
      bVar4 = 0;
    }
    else {
      bVar4 = (byte)(local_628->offsetAndKind).value & 1;
    }
    local_598.segment._0_1_ = bVar4;
    kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xec,ERROR,
               "\"failed: expected \" \"(true) == (subReader.getBoolField())\", _kjCondition, true, subReader.getBoolField()"
               ,(char (*) [54])"failed: expected (true) == (subReader.getBoolField())",
               (DebugComparison<bool,_bool> *)local_608,(bool *)local_5c8,(bool *)&local_598);
  }
  if (local_618 < 0x10) {
    cVar11 = '\0';
  }
  else {
    cVar11 = *(char *)((long)&(local_628->offsetAndKind).value + 1);
  }
  _local_608 = CONCAT14(cVar11,0xfffffff4);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = cVar11 == -0xc;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((cVar11 != -0xc) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_4_ = 0xfffffff4;
    if (local_618 < 0x10) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined1 *)((long)&(local_628->offsetAndKind).value + 1);
    }
    local_598.segment._0_1_ = uVar5;
    kj::_::Debug::log<char_const(&)[53],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xed,ERROR,
               "\"failed: expected \" \"(-12) == (subReader.getInt8Field())\", _kjCondition, -12, subReader.getInt8Field()"
               ,(char (*) [53])"failed: expected (-12) == (subReader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)local_608,(int *)local_5c8,(char *)&local_598);
  }
  if (local_618 < 0x20) {
    sVar12 = 0;
  }
  else {
    sVar12 = *(short *)((long)&(local_628->offsetAndKind).value + 2);
  }
  _local_608 = CONCAT24(sVar12,0xd80);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = sVar12 == 0xd80;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((sVar12 != 0xd80) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_4_ = 0xd80;
    if (local_618 < 0x20) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined2 *)((long)&(local_628->offsetAndKind).value + 2);
    }
    local_598.segment._0_2_ = uVar7;
    kj::_::Debug::log<char_const(&)[55],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xee,ERROR,
               "\"failed: expected \" \"(3456) == (subReader.getInt16Field())\", _kjCondition, 3456, subReader.getInt16Field()"
               ,(char (*) [55])"failed: expected (3456) == (subReader.getInt16Field())",
               (DebugComparison<int,_short> *)local_608,(int *)local_5c8,(short *)&local_598);
  }
  uVar15 = 0;
  if (0x3f < local_618) {
    uVar15 = (local_628->field_1).upper32Bits;
  }
  _local_608 = (char *)CONCAT44(uVar15,0xfb4c100e);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = uVar15 == 0xfb4c100e;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((uVar15 != 0xfb4c100e) && (kj::_::Debug::minSeverity < 3)) {
    uVar15 = 0;
    local_5c8._0_4_ = 0xfb4c100e;
    if (0x3f < local_618) {
      uVar15 = (local_628->field_1).upper32Bits;
    }
    local_598.segment._0_4_ = uVar15;
    kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xef,ERROR,
               "\"failed: expected \" \"(-78901234) == (subReader.getInt32Field())\", _kjCondition, -78901234, subReader.getInt32Field()"
               ,(char (*) [60])"failed: expected (-78901234) == (subReader.getInt32Field())",
               (DebugComparison<int,_int> *)local_608,(int *)local_5c8,(int *)&local_598);
  }
  if (local_618 < 0x80) {
    WStack_600.offsetAndKind.value = 0;
    WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  else {
    WStack_600 = local_628[1];
  }
  _local_608 = (char *)0x33a638e8734e;
  local_5f8 = (undefined1  [8])0x299598;
  uStack_5f0 = (WirePointer *)&DAT_00000005;
  local_5e8 = (char *)CONCAT71(local_5e8._1_7_,WStack_600 == (WirePointer)0x33a638e8734e);
  pWVar2 = (WirePointer *)0x0;
  if ((WStack_600 != (WirePointer)0x33a638e8734e) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_8_ = (char *)0x33a638e8734e;
    if (local_618 < 0x80) {
      WVar9.offsetAndKind.value = 0;
      WVar9.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar9 = local_628[1];
    }
    local_598.segment = (SegmentReader *)WVar9;
    kj::_::Debug::log<char_const(&)[67],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf0,ERROR,
               "\"failed: expected \" \"(56789012345678ll) == (subReader.getInt64Field())\", _kjCondition, 56789012345678ll, subReader.getInt64Field()"
               ,(char (*) [67])"failed: expected (56789012345678ll) == (subReader.getInt64Field())",
               (DebugComparison<long_long,_long> *)local_608,(longlong *)local_5c8,
               (long *)&local_598);
    pWVar2 = uStack_5f0;
  }
  uStack_5f0 = pWVar2;
  if (local_618 < 0x88) {
    cVar11 = '\0';
  }
  else {
    cVar11 = (char)local_628[2].offsetAndKind.value;
  }
  _local_608 = CONCAT14(cVar11,0x5a);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = cVar11 == 'Z';
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((cVar11 != 'Z') && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_4_ = 0x5a;
    if (local_618 < 0x88) {
      uVar5 = 0;
    }
    else {
      uVar5 = (undefined1)local_628[2].offsetAndKind.value;
    }
    local_598.segment._0_1_ = uVar5;
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf1,ERROR,
               "\"failed: expected \" \"(90u) == (subReader.getUInt8Field())\", _kjCondition, 90u, subReader.getUInt8Field()"
               ,(char (*) [54])"failed: expected (90u) == (subReader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)local_608,(uint *)local_5c8,
               (uchar *)&local_598);
  }
  if (local_618 < 0xa0) {
    sVar12 = 0;
  }
  else {
    sVar12 = *(short *)((long)&local_628[2].offsetAndKind.value + 2);
  }
  _local_608 = CONCAT24(sVar12,0x4d2);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = sVar12 == 0x4d2;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((sVar12 != 0x4d2) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_4_ = 0x4d2;
    if (local_618 < 0xa0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined2 *)((long)&local_628[2].offsetAndKind.value + 2);
    }
    local_598.segment._0_2_ = uVar7;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf2,ERROR,
               "\"failed: expected \" \"(1234u) == (subReader.getUInt16Field())\", _kjCondition, 1234u, subReader.getUInt16Field()"
               ,(char (*) [57])"failed: expected (1234u) == (subReader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)local_608,(uint *)local_5c8,
               (unsigned_short *)&local_598);
  }
  uVar15 = 0;
  if (0xbf < local_618) {
    uVar15 = local_628[2].field_1.upper32Bits;
  }
  _local_608 = (char *)CONCAT44(uVar15,0x3628814);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = uVar15 == 0x3628814;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((uVar15 != 0x3628814) && (kj::_::Debug::minSeverity < 3)) {
    uVar15 = 0;
    local_5c8._0_4_ = 0x3628814;
    if (0xbf < local_618) {
      uVar15 = local_628[2].field_1.upper32Bits;
    }
    local_598.segment._0_4_ = uVar15;
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf3,ERROR,
               "\"failed: expected \" \"(56789012u) == (subReader.getUInt32Field())\", _kjCondition, 56789012u, subReader.getUInt32Field()"
               ,(char (*) [61])"failed: expected (56789012u) == (subReader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_608,(uint *)local_5c8,
               (uint *)&local_598);
  }
  if (local_618 < 0x100) {
    WStack_600.offsetAndKind.value = 0;
    WStack_600.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  else {
    WStack_600 = local_628[3];
  }
  _local_608 = (char *)0x4cc1921126f0ad2;
  uStack_5f0 = (WirePointer *)0x5;
  local_5f8 = (undefined1  [8])" == ";
  local_5e8 = (char *)CONCAT71(local_5e8._1_7_,WStack_600 == (WirePointer)0x4cc1921126f0ad2);
  if ((WStack_600 != (WirePointer)0x4cc1921126f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_8_ = (char *)0x4cc1921126f0ad2;
    if (local_618 < 0x100) {
      WVar10.offsetAndKind.value = 0;
      WVar10.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      WVar10 = local_628[3];
    }
    local_598.segment = (SegmentReader *)WVar10;
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf4,ERROR,
               "\"failed: expected \" \"(345678901234567890ull) == (subReader.getUInt64Field())\", _kjCondition, 345678901234567890ull, subReader.getUInt64Field()"
               ,(char (*) [73])
                "failed: expected (345678901234567890ull) == (subReader.getUInt64Field())",
               (DebugComparison<unsigned_long_long,_unsigned_long> *)local_608,
               (unsigned_long_long *)local_5c8,(unsigned_long *)&local_598);
  }
  fVar18 = 0.0;
  if (0x11f < local_618) {
    fVar18 = (float)local_628[4].offsetAndKind.value;
  }
  if ((fVar18 != -1.25e-10) || (NAN(fVar18))) {
    fVar23 = fVar18 + 1.25e-10;
    fVar25 = -fVar23;
    if (-fVar23 <= fVar23) {
      fVar25 = fVar23;
    }
    fVar23 = -fVar18;
    if (-fVar18 <= fVar18) {
      fVar23 = fVar18;
    }
    fVar18 = (fVar23 + 1.25e-10) * 1e-05;
    local_598.segment._0_1_ = fVar25 < fVar18;
    if ((fVar18 <= fVar25) && (kj::_::Debug::minSeverity < 3)) {
      uVar19 = 0;
      if (0x11f < local_618) {
        uVar19 = local_628[4].offsetAndKind.value;
      }
      _local_608 = (char *)CONCAT44(uStack_604,uVar19);
      local_5c8._0_4_ = 0xaf09705f;
      kj::_::Debug::log<char_const(&)[84],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)\", _kjCondition, subReader.getFloat32Field(), -1.25e-10f"
                 ,(char (*) [84])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)"
                 ,(DebugExpression<bool> *)&local_598,(float *)local_608,(float *)local_5c8);
    }
  }
  WVar20.value = 0;
  aVar22.upper32Bits = 0;
  if (0x17f < local_618) {
    WVar20 = local_628[5].offsetAndKind;
    aVar22 = local_628[5].field_1;
  }
  pCVar16 = local_598.capTable;
  if (((double)CONCAT44(aVar22.upper32Bits,WVar20.value) != 345.0) ||
     (NAN((double)CONCAT44(aVar22.upper32Bits,WVar20.value)))) {
    dVar26 = (double)CONCAT44(aVar22.upper32Bits,WVar20.value) + -345.0;
    dVar27 = -dVar26;
    if (-dVar26 <= dVar26) {
      dVar27 = dVar26;
    }
    aVar24.upper32Bits =
         (uint32_t)((ulong)-(double)CONCAT44(aVar22.upper32Bits,WVar20.value) >> 0x20);
    if (-(double)CONCAT44(aVar22.upper32Bits,WVar20.value) <=
        (double)CONCAT44(aVar22.upper32Bits,WVar20.value)) {
      aVar24 = aVar22;
    }
    dVar26 = ((double)CONCAT44(aVar24.upper32Bits,WVar20.value) + 345.0) * 1e-12;
    local_598.segment._0_1_ = dVar27 < dVar26;
    if ((dVar26 <= dVar27) && (kj::_::Debug::minSeverity < 3)) {
      WVar20.value = 0;
      aVar22.upper32Bits = 0;
      if (0x17f < local_618) {
        WVar20 = local_628[5].offsetAndKind;
        aVar22 = local_628[5].field_1;
      }
      _local_608 = (char *)CONCAT44(aVar22.upper32Bits,WVar20.value);
      local_5c8._0_4_ = 0x159;
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf6,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)\", _kjCondition, subReader.getFloat64Field(), 345"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)",
                 (DebugExpression<bool> *)&local_598,(double *)local_608,(int *)local_5c8);
      pCVar16 = local_598.capTable;
    }
  }
  local_598.capTable = pCVar16;
  local_598.segment = (SegmentReader *)"baz";
  if (local_614 == 0) {
    uStack_5f0._0_4_ = 0x7fffffff;
    WStack_600 = (WirePointer)0x0;
    local_5f8 = (undefined1  [8])0x0;
    _local_608 = (char *)0x0;
  }
  else {
    WStack_600 = local_630;
    local_5f8 = (undefined1  [8])local_620;
    _local_608 = (char *)local_638;
    uStack_5f0._0_4_ = local_610;
  }
  local_5c8._0_16_ =
       (undefined1  [16])
       PointerReader::getBlob<capnp::Text>((PointerReader *)local_608,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_608,
             (DebugExpression<char_const(&)[4]> *)&local_598,(Reader *)local_5c8);
  if ((sStack_5e0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    if (local_614 == 0) {
      local_5b0 = 0x7fffffff;
      local_5c8._8_8_ = (CapTableReader *)0x0;
      local_5c8._16_8_ = (WirePointer *)0x0;
      local_5c8._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_5c8._8_8_ = local_630;
      local_5c8._16_8_ = local_620;
      local_5c8._0_8_ = local_638;
      local_5b0 = local_610;
    }
    local_5c8._0_16_ =
         (undefined1  [16])
         PointerReader::getBlob<capnp::Text>((PointerReader *)local_5c8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf7,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (subReader.getTextField())\", _kjCondition, \"baz\", subReader.getTextField()"
               ,(char (*) [55])"failed: expected (\"baz\") == (subReader.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_608,
               (char (*) [4])0x2a1727,(Reader *)local_5c8);
  }
  if (local_614 < 2) {
    uStack_5f0._0_4_ = 0x7fffffff;
    WStack_600 = (WirePointer)0x0;
    local_5f8 = (undefined1  [8])0x0;
    _local_608 = (char *)0x0;
  }
  else {
    local_5f8 = (undefined1  [8])(local_620 + 1);
    WStack_600 = local_630;
    _local_608 = (char *)local_638;
    uStack_5f0._0_4_ = local_610;
  }
  bVar17 = false;
  _local_5f8 = (ArrayPtr<const_unsigned_char>)
               PointerReader::getBlob<capnp::Data>((PointerReader *)local_608,(void *)0x0,0);
  if (local_5f8._8_8_ == 3) {
    bVar17 = (char)*(short *)((long)local_5f8 + 2) == 'x' && *(short *)local_5f8 == 0x7571;
  }
  _local_608 = "qux";
  WStack_600 = (WirePointer)0x3;
  local_5e8 = " == ";
  sStack_5e0 = 5;
  local_5d8 = bVar17;
  if ((bVar17 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_598.capTable = (CapTableReader *)0x3;
    local_598.segment = (SegmentReader *)"qux";
    if (local_614 < 2) {
      local_5b0 = 0x7fffffff;
      local_5c8._8_8_ = (CapTableReader *)0x0;
      local_5c8._16_8_ = (WirePointer *)0x0;
      local_5c8._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_5c8._16_8_ = local_620 + 1;
      local_5c8._8_8_ = local_630;
      local_5c8._0_8_ = local_638;
      local_5b0 = local_610;
    }
    local_5c8._0_16_ =
         (undefined1  [16])
         PointerReader::getBlob<capnp::Data>((PointerReader *)local_5c8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf8,ERROR,
               "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.getDataField())\", _kjCondition, data(\"qux\"), subReader.getDataField()"
               ,(char (*) [61])"failed: expected (data(\"qux\")) == (subReader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)local_608,
               (Reader *)&local_598,(Reader *)local_5c8);
  }
  if (local_614 < 3) {
    local_5c8._8_8_ = (CapTableReader *)0x0;
    local_5c8._16_8_ = (WirePointer *)0x0;
    local_5c8._0_8_ = (Exception *)0x0;
    local_5b0 = 0x7fffffff;
  }
  else {
    local_5c8._16_8_ = local_620 + 2;
    local_5c8._8_8_ = local_630;
    local_5c8._0_8_ = local_638;
    local_5b0 = local_610;
  }
  PointerReader::getStruct((StructReader *)local_608,(PointerReader *)local_5c8,(word *)0x0);
  local_560.segment = (SegmentReader *)"nested";
  local_5c8._16_8_ = (WirePointer *)0x0;
  local_5c8._0_8_ = (Exception *)0x0;
  local_5c8._8_8_ = (CapTableReader *)0x0;
  local_5b0 = 0x7fffffff;
  if (local_5e8._4_2_ != 0) {
    local_5c8._16_8_ = uStack_5f0;
    local_5c8._0_8_ = _local_608;
    local_5c8._8_8_ = WStack_600;
    local_5b0 = (int)sStack_5e0;
  }
  local_598._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5c8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)local_5c8,
             (DebugExpression<char_const(&)[7]> *)&local_560,(Reader *)&local_598);
  if ((local_5a0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    if (local_5e8._4_2_ == 0) {
      local_598.pointers._0_4_ = 0x7fffffff;
      local_598.capTable = (CapTableReader *)0x0;
      local_598.data = (WirePointer *)0x0;
      local_598.segment = (SegmentReader *)0x0;
    }
    else {
      local_598.capTable = (CapTableReader *)WStack_600;
      local_598.data = uStack_5f0;
      local_598.segment = (SegmentReader *)_local_608;
      local_598.pointers._0_4_ = (int)sStack_5e0;
    }
    local_598._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_598,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Reader>&,char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xfb,ERROR,
               "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.getTextField())\", _kjCondition, \"nested\", subSubReader.getTextField()"
               ,(char (*) [61])"failed: expected (\"nested\") == (subSubReader.getTextField())",
               (DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)local_5c8,
               (char (*) [7])0x2b06d5,(Reader *)&local_598);
  }
  local_568 = "really nested";
  if (local_5e8._4_2_ < 3) {
    local_5c8._8_8_ = (CapTableReader *)0x0;
    local_5c8._16_8_ = (WirePointer *)0x0;
    local_5c8._0_8_ = (Exception *)0x0;
    local_5b0 = 0x7fffffff;
  }
  else {
    local_5c8._16_8_ = uStack_5f0 + 2;
    local_5c8._8_8_ = WStack_600;
    local_5c8._0_8_ = _local_608;
    local_5b0 = (int)sStack_5e0;
  }
  PointerReader::getStruct(&local_598,(PointerReader *)local_5c8,(word *)0x0);
  local_5c8._16_8_ = (WirePointer *)0x0;
  local_5c8._0_8_ = (SegmentReader *)0x0;
  local_5c8._8_8_ = (CapTableReader *)0x0;
  local_5b0 = 0x7fffffff;
  if (local_598.pointerCount != 0) {
    local_5c8._16_8_ = CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
    local_5c8._0_8_ = local_598.segment;
    local_5c8._8_8_ = local_598.capTable;
    local_5b0 = local_598.nestingLimit;
  }
  local_560._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5c8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            ((DebugComparison<const_char_(&)[14],_capnp::Text::Reader> *)local_5c8,
             (DebugExpression<char_const(&)[14]> *)&local_568,(Reader *)&local_560);
  if ((local_5a0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    if (local_5e8._4_2_ < 3) {
      local_560.capTable = (CapTableReader *)0x0;
      local_560.pointer = (WirePointer *)0x0;
      local_560.segment = (SegmentReader *)0x0;
      local_560.nestingLimit = 0x7fffffff;
    }
    else {
      local_560.pointer = uStack_5f0 + 2;
      local_560.capTable = (CapTableReader *)WStack_600;
      local_560.segment = (SegmentReader *)_local_608;
      local_560.nestingLimit = (int)sStack_5e0;
    }
    PointerReader::getStruct(&local_598,&local_560,(word *)0x0);
    local_560.pointer = (WirePointer *)0x0;
    local_560.segment = (SegmentReader *)0x0;
    local_560.capTable = (CapTableReader *)0x0;
    local_560.nestingLimit = 0x7fffffff;
    if (local_598.pointerCount != 0) {
      local_560.pointer = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
      local_560.segment = local_598.segment;
      local_560.capTable = local_598.capTable;
      local_560.nestingLimit = local_598.nestingLimit;
    }
    local_560._0_16_ = PointerReader::getBlob<capnp::Text>(&local_560,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Reader>&,char_const(&)[14],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xfc,ERROR,
               "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.getStructField().getTextField())\", _kjCondition, \"really nested\", subSubReader.getStructField().getTextField()"
               ,(char (*) [85])
                "failed: expected (\"really nested\") == (subSubReader.getStructField().getTextField())"
               ,(DebugComparison<const_char_(&)[14],_capnp::Text::Reader> *)local_5c8,
               (char (*) [14])"really nested",(Reader *)&local_560);
  }
  pWVar2 = uStack_5f0;
  if (local_618 < 0x130) {
    uVar6 = 0;
  }
  else {
    uVar6 = local_628[4].field_1.structRef.dataSize.value;
  }
  _local_608 = (float)CONCAT22(uVar6,2);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = uVar6 == 2;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  AVar1 = (ArrayPtr<const_char>)_local_5f8;
  uStack_5f0._4_4_ = SUB84(pWVar2,4);
  if ((uVar6 != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_2_ = 2;
    if (local_618 < 0x130) {
      uVar6 = 0;
    }
    else {
      uVar6 = local_628[4].field_1.structRef.dataSize.value;
    }
    local_598.segment._0_2_ = uVar6;
    _local_5f8 = (ArrayPtr<const_unsigned_char>)AVar1;
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xfe,ERROR,
               "\"failed: expected \" \"(TestEnum::BAZ) == (subReader.getEnumField())\", _kjCondition, TestEnum::BAZ, subReader.getEnumField()"
               ,(char (*) [63])"failed: expected (TestEnum::BAZ) == (subReader.getEnumField())",
               (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                *)local_608,(TestEnum_9c8e9318b29d9cd3 *)local_5c8,
               (TestEnum_9c8e9318b29d9cd3 *)&local_598);
  }
  if (local_614 < 4) {
    WStack_600 = (WirePointer)0x0;
    local_5f8 = (undefined1  [8])0x0;
    _local_608 = (char *)0x0;
    uStack_5f0._0_4_ = 0x7fffffff;
  }
  else {
    local_5f8 = (undefined1  [8])(local_620 + 3);
    WStack_600 = local_630;
    _local_608 = (char *)local_638;
    uStack_5f0._0_4_ = local_610;
  }
  PointerReader::getList(&local_60,(PointerReader *)local_608,VOID,(word *)0x0);
  reader_00.reader.capTable = local_60.capTable;
  reader_00.reader.segment = local_60.segment;
  reader_00.reader.ptr = local_60.ptr;
  reader_00.reader.elementCount = local_60.elementCount;
  reader_00.reader.step = local_60.step;
  reader_00.reader.structDataSize = local_60.structDataSize;
  reader_00.reader.structPointerCount = local_60.structPointerCount;
  reader_00.reader.elementSize = local_60.elementSize;
  reader_00.reader._39_1_ = local_60._39_1_;
  reader_00.reader.nestingLimit = local_60.nestingLimit;
  reader_00.reader._44_4_ = local_60._44_4_;
  expected._M_len = 3;
  expected._M_array = (iterator)local_608;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Reader,_capnp::List<capnp::Void,_(capnp::Kind)0>_>
            (reader_00,expected);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (4 < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 4);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    uStack_5f0._0_4_ = local_610;
  }
  PointerReader::getList(&local_90,(PointerReader *)local_608,BIT,(word *)0x0);
  _local_608 = (char *)CONCAT35(uStack_604._1_3_,0x101000100);
  reader_01.reader.capTable = local_90.capTable;
  reader_01.reader.segment = local_90.segment;
  reader_01.reader.ptr = local_90.ptr;
  reader_01.reader.elementCount = local_90.elementCount;
  reader_01.reader.step = local_90.step;
  reader_01.reader.structDataSize = local_90.structDataSize;
  reader_01.reader.structPointerCount = local_90.structPointerCount;
  reader_01.reader.elementSize = local_90.elementSize;
  reader_01.reader._39_1_ = local_90._39_1_;
  reader_01.reader.nestingLimit = local_90.nestingLimit;
  reader_01.reader._44_4_ = local_90._44_4_;
  expected_00._M_len = 5;
  expected_00._M_array = (iterator)local_608;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Reader,_capnp::List<bool,_(capnp::Kind)0>_>
            (reader_01,expected_00);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (5 < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 5);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    uStack_5f0._0_4_ = local_610;
  }
  PointerReader::getList(&local_c0,(PointerReader *)local_608,BYTE,(word *)0x0);
  _local_608 = (char *)CONCAT44(uStack_604,0x7f80de0c);
  reader_02.reader.capTable = local_c0.capTable;
  reader_02.reader.segment = local_c0.segment;
  reader_02.reader.ptr = local_c0.ptr;
  reader_02.reader.elementCount = local_c0.elementCount;
  reader_02.reader.step = local_c0.step;
  reader_02.reader.structDataSize = local_c0.structDataSize;
  reader_02.reader.structPointerCount = local_c0.structPointerCount;
  reader_02.reader.elementSize = local_c0.elementSize;
  reader_02.reader._39_1_ = local_c0._39_1_;
  reader_02.reader.nestingLimit = local_c0.nestingLimit;
  reader_02.reader._44_4_ = local_c0._44_4_;
  expected_01._M_len = 4;
  expected_01._M_array = local_608;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Reader,_capnp::List<signed_char,_(capnp::Kind)0>_>
            (reader_02,expected_01);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (6 < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 6);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    uStack_5f0._0_4_ = local_610;
  }
  PointerReader::getList(&local_f0,(PointerReader *)local_608,TWO_BYTES,(word *)0x0);
  _local_608 = (char *)0x7fff8000e9d204d2;
  reader_03.reader.capTable = local_f0.capTable;
  reader_03.reader.segment = local_f0.segment;
  reader_03.reader.ptr = local_f0.ptr;
  reader_03.reader.elementCount = local_f0.elementCount;
  reader_03.reader.step = local_f0.step;
  reader_03.reader.structDataSize = local_f0.structDataSize;
  reader_03.reader.structPointerCount = local_f0.structPointerCount;
  reader_03.reader.elementSize = local_f0.elementSize;
  reader_03.reader._39_1_ = local_f0._39_1_;
  reader_03.reader.nestingLimit = local_f0.nestingLimit;
  reader_03.reader._44_4_ = local_f0._44_4_;
  expected_02._M_len = 4;
  expected_02._M_array = (iterator)local_608;
  checkList<capnp::List<short,_(capnp::Kind)0>::Reader,_capnp::List<short,_(capnp::Kind)0>_>
            (reader_03,expected_02);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (7 < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 7);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    uStack_5f0._0_4_ = local_610;
  }
  PointerReader::getList(&local_120,(PointerReader *)local_608,FOUR_BYTES,(word *)0x0);
  _local_608 = (char *)0xfaa0d34000bc614e;
  WStack_600 = (WirePointer)0x7fffffff80000000;
  reader_04.reader.capTable = local_120.capTable;
  reader_04.reader.segment = local_120.segment;
  reader_04.reader.ptr = local_120.ptr;
  reader_04.reader.elementCount = local_120.elementCount;
  reader_04.reader.step = local_120.step;
  reader_04.reader.structDataSize = local_120.structDataSize;
  reader_04.reader.structPointerCount = local_120.structPointerCount;
  reader_04.reader.elementSize = local_120.elementSize;
  reader_04.reader._39_1_ = local_120._39_1_;
  reader_04.reader.nestingLimit = local_120.nestingLimit;
  reader_04.reader._44_4_ = local_120._44_4_;
  expected_03._M_len = 4;
  expected_03._M_array = (iterator)local_608;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_04,expected_03);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (8 < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 8);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    uStack_5f0._0_4_ = local_610;
  }
  PointerReader::getList(&local_150,(PointerReader *)local_608,EIGHT_BYTES,(word *)0x0);
  local_5f8 = (undefined1  [8])0x8000000000000000;
  uStack_5f0 = (WirePointer *)0x7fffffffffffffff;
  _local_608 = (char *)0x7048860ddf79;
  WStack_600 = (WirePointer)0xfffd968afd13752e;
  reader_05.reader.capTable = local_150.capTable;
  reader_05.reader.segment = local_150.segment;
  reader_05.reader.ptr = local_150.ptr;
  reader_05.reader.elementCount = local_150.elementCount;
  reader_05.reader.step = local_150.step;
  reader_05.reader.structDataSize = local_150.structDataSize;
  reader_05.reader.structPointerCount = local_150.structPointerCount;
  reader_05.reader.elementSize = local_150.elementSize;
  reader_05.reader._39_1_ = local_150._39_1_;
  reader_05.reader.nestingLimit = local_150.nestingLimit;
  reader_05.reader._44_4_ = local_150._44_4_;
  expected_04._M_len = 4;
  expected_04._M_array = (iterator)local_608;
  checkList<capnp::List<long,_(capnp::Kind)0>::Reader,_capnp::List<long,_(capnp::Kind)0>_>
            (reader_05,expected_04);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  iVar13 = 0x7fffffff;
  if (9 < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 9);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    iVar13 = local_610;
  }
  uStack_5f0._0_4_ = iVar13;
  PointerReader::getList(&local_180,(PointerReader *)local_608,BYTE,(word *)0x0);
  _local_608 = (char *)CONCAT44(uStack_604,0xff00220c);
  reader_06.reader.capTable = local_180.capTable;
  reader_06.reader.segment = local_180.segment;
  reader_06.reader.ptr = local_180.ptr;
  reader_06.reader.elementCount = local_180.elementCount;
  reader_06.reader.step = local_180.step;
  reader_06.reader.structDataSize = local_180.structDataSize;
  reader_06.reader.structPointerCount = local_180.structPointerCount;
  reader_06.reader.elementSize = local_180.elementSize;
  reader_06.reader._39_1_ = local_180._39_1_;
  reader_06.reader.nestingLimit = local_180.nestingLimit;
  reader_06.reader._44_4_ = local_180._44_4_;
  expected_05._M_len = 4;
  expected_05._M_array = local_608;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_06,expected_05);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (10 < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 10);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    uStack_5f0._0_4_ = local_610;
  }
  PointerReader::getList(&local_1b0,(PointerReader *)local_608,TWO_BYTES,(word *)0x0);
  _local_608 = (char *)0xffff0000162e04d2;
  reader_07.reader.capTable = local_1b0.capTable;
  reader_07.reader.segment = local_1b0.segment;
  reader_07.reader.ptr = local_1b0.ptr;
  reader_07.reader.elementCount = local_1b0.elementCount;
  reader_07.reader.step = local_1b0.step;
  reader_07.reader.structDataSize = local_1b0.structDataSize;
  reader_07.reader.structPointerCount = local_1b0.structPointerCount;
  reader_07.reader.elementSize = local_1b0.elementSize;
  reader_07.reader._39_1_ = local_1b0._39_1_;
  reader_07.reader.nestingLimit = local_1b0.nestingLimit;
  reader_07.reader._44_4_ = local_1b0._44_4_;
  expected_06._M_len = 4;
  expected_06._M_array = (iterator)local_608;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_07,expected_06);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (0xb < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 0xb);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    uStack_5f0._0_4_ = local_610;
  }
  PointerReader::getList(&local_1e0,(PointerReader *)local_608,FOUR_BYTES,(word *)0x0);
  _local_608 = (char *)0x55f2cc000bc614e;
  WStack_600 = (WirePointer)0xffffffff00000000;
  reader_08.reader.capTable = local_1e0.capTable;
  reader_08.reader.segment = local_1e0.segment;
  reader_08.reader.ptr = local_1e0.ptr;
  reader_08.reader.elementCount = local_1e0.elementCount;
  reader_08.reader.step = local_1e0.step;
  reader_08.reader.structDataSize = local_1e0.structDataSize;
  reader_08.reader.structPointerCount = local_1e0.structPointerCount;
  reader_08.reader.elementSize = local_1e0.elementSize;
  reader_08.reader._39_1_ = local_1e0._39_1_;
  reader_08.reader.nestingLimit = local_1e0.nestingLimit;
  reader_08.reader._44_4_ = local_1e0._44_4_;
  expected_07._M_len = 4;
  expected_07._M_array = (iterator)local_608;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_08,expected_07);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (0xc < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 0xc);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    uStack_5f0._0_4_ = local_610;
  }
  PointerReader::getList(&local_210,(PointerReader *)local_608,EIGHT_BYTES,(word *)0x0);
  local_5f8 = (undefined1  [8])0x0;
  uStack_5f0 = (WirePointer *)0xffffffffffffffff;
  _local_608 = (char *)0x7048860ddf79;
  WStack_600 = (WirePointer)0x2697502ec8ad2;
  reader_09.reader.capTable = local_210.capTable;
  reader_09.reader.segment = local_210.segment;
  reader_09.reader.ptr = local_210.ptr;
  reader_09.reader.elementCount = local_210.elementCount;
  reader_09.reader.step = local_210.step;
  reader_09.reader.structDataSize = local_210.structDataSize;
  reader_09.reader.structPointerCount = local_210.structPointerCount;
  reader_09.reader.elementSize = local_210.elementSize;
  reader_09.reader._39_1_ = local_210._39_1_;
  reader_09.reader.nestingLimit = local_210.nestingLimit;
  reader_09.reader._44_4_ = local_210._44_4_;
  expected_08._M_len = 4;
  expected_08._M_array = (iterator)local_608;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_09,expected_08);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  iVar13 = 0x7fffffff;
  if (0xd < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 0xd);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    iVar13 = local_610;
  }
  uStack_5f0._0_4_ = iVar13;
  PointerReader::getList(&local_240,(PointerReader *)local_608,FOUR_BYTES,(word *)0x0);
  _local_608 = (char *)0x4996b43800000000;
  WStack_600 = (WirePointer)0xfcf0bdc27cf0bdc2;
  local_5f8 = (undefined1  [8])0x82081cea02081cea;
  reader_10.reader.capTable = local_240.capTable;
  reader_10.reader.segment = local_240.segment;
  reader_10.reader.ptr = local_240.ptr;
  reader_10.reader.elementCount = local_240.elementCount;
  reader_10.reader.step = local_240.step;
  reader_10.reader.structDataSize = local_240.structDataSize;
  reader_10.reader.structPointerCount = local_240.structPointerCount;
  reader_10.reader.elementSize = local_240.elementSize;
  reader_10.reader._39_1_ = local_240._39_1_;
  reader_10.reader.nestingLimit = local_240.nestingLimit;
  reader_10.reader._44_4_ = local_240._44_4_;
  expected_09._M_len = 6;
  expected_09._M_array = (iterator)local_608;
  checkList<capnp::List<float,_(capnp::Kind)0>::Reader,_capnp::List<float,_(capnp::Kind)0>_>
            (reader_10,expected_09);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  iVar13 = 0x7fffffff;
  if (0xe < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 0xe);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    iVar13 = local_610;
  }
  uStack_5f0._0_4_ = iVar13;
  PointerReader::getList(&local_270,(PointerReader *)local_608,EIGHT_BYTES,(word *)0x0);
  local_5e8 = (char *)0x66789e3750f791;
  sStack_5e0 = 0x8066789e3750f791;
  local_5f8 = (undefined1  [8])0x7f76c8e5ca239029;
  uStack_5f0 = (WirePointer *)0xff76c8e5ca239029;
  _local_608 = (char *)0x0;
  WStack_600 = (WirePointer)0x42dc12218377de40;
  reader_11.reader.capTable = local_270.capTable;
  reader_11.reader.segment = local_270.segment;
  reader_11.reader.ptr = local_270.ptr;
  reader_11.reader.elementCount = local_270.elementCount;
  reader_11.reader.step = local_270.step;
  reader_11.reader.structDataSize = local_270.structDataSize;
  reader_11.reader.structPointerCount = local_270.structPointerCount;
  reader_11.reader.elementSize = local_270.elementSize;
  reader_11.reader._39_1_ = local_270._39_1_;
  reader_11.reader.nestingLimit = local_270.nestingLimit;
  reader_11.reader._44_4_ = local_270._44_4_;
  expected_10._M_len = 6;
  expected_10._M_array = (iterator)local_608;
  checkList<capnp::List<double,_(capnp::Kind)0>::Reader,_capnp::List<double,_(capnp::Kind)0>_>
            (reader_11,expected_10);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  iVar13 = 0x7fffffff;
  if (0xf < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 0xf);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    iVar13 = local_610;
  }
  uStack_5f0._0_4_ = iVar13;
  PointerReader::getList(&local_2a0,(PointerReader *)local_608,POINTER,(word *)0x0);
  _local_608 = "quux";
  WStack_600 = (WirePointer)&DAT_00000005;
  local_5f8 = (undefined1  [8])0x2aa02a;
  uStack_5f0 = (WirePointer *)0x6;
  local_5e8 = "grault";
  sStack_5e0 = 7;
  reader_12.reader.capTable = local_2a0.capTable;
  reader_12.reader.segment = local_2a0.segment;
  reader_12.reader.ptr = local_2a0.ptr;
  reader_12.reader.elementCount = local_2a0.elementCount;
  reader_12.reader.step = local_2a0.step;
  reader_12.reader.structDataSize = local_2a0.structDataSize;
  reader_12.reader.structPointerCount = local_2a0.structPointerCount;
  reader_12.reader.elementSize = local_2a0.elementSize;
  reader_12.reader._39_1_ = local_2a0._39_1_;
  reader_12.reader.nestingLimit = local_2a0.nestingLimit;
  reader_12.reader._44_4_ = local_2a0._44_4_;
  expected_11._M_len = 3;
  expected_11._M_array = (iterator)local_608;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_12,expected_11);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  iVar13 = 0x7fffffff;
  if (0x10 < local_614) {
    local_5f8 = (undefined1  [8])(local_620 + 0x10);
    _local_608 = (char *)local_638;
    WStack_600 = local_630;
    iVar13 = local_610;
  }
  uStack_5f0._0_4_ = iVar13;
  PointerReader::getList(&local_2d0,(PointerReader *)local_608,POINTER,(word *)0x0);
  _local_608 = "garply";
  WStack_600 = (WirePointer)0x6;
  uStack_5f0 = (WirePointer *)0x5;
  local_5f8 = (undefined1  [8])anon_var_dwarf_b858a;
  local_5e8 = "fred";
  sStack_5e0 = 4;
  reader_13.reader.capTable = local_2d0.capTable;
  reader_13.reader.segment = local_2d0.segment;
  reader_13.reader.ptr = local_2d0.ptr;
  reader_13.reader.elementCount = local_2d0.elementCount;
  reader_13.reader.step = local_2d0.step;
  reader_13.reader.structDataSize = local_2d0.structDataSize;
  reader_13.reader.structPointerCount = local_2d0.structPointerCount;
  reader_13.reader.elementSize = local_2d0.elementSize;
  reader_13.reader._39_1_ = local_2d0._39_1_;
  reader_13.reader.nestingLimit = local_2d0.nestingLimit;
  reader_13.reader._44_4_ = local_2d0._44_4_;
  expected_12._M_len = 3;
  expected_12._M_array = (iterator)local_608;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Data,_(capnp::Kind)1>_>
            (reader_13,expected_12);
  local_5c8._16_8_ = (WirePointer *)0x0;
  local_5c8._0_8_ = (SegmentReader *)0x0;
  local_5c8._8_8_ = (CapTableReader *)0x0;
  local_5b0 = 0x7fffffff;
  if (0x11 < local_614) {
    local_5c8._16_8_ = local_620 + 0x11;
    local_5c8._0_8_ = local_638;
    local_5c8._8_8_ = local_630;
    local_5b0 = local_610;
  }
  PointerReader::getList
            ((ListReader *)local_608,(PointerReader *)local_5c8,INLINE_COMPOSITE,(word *)0x0);
  local_5c8._4_4_ = (ListElementCount)uStack_5f0;
  local_5c8._0_4_ = 3;
  local_5c8._8_8_ = " == ";
  local_5c8._16_8_ = &DAT_00000005;
  local_5b0 = CONCAT31(local_5b0._1_3_,(ListElementCount)uStack_5f0 == 3);
  if ((ListElementCount)uStack_5f0 != 3) {
    local_560.segment._0_4_ = 3;
    local_568 = (char *)CONCAT44(local_568._4_4_,(ListElementCount)uStack_5f0);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)&local_598,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x111,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_5c8,(uint *)&local_560,
               (uint *)&local_568);
    kj::_::Debug::Fault::fatal((Fault *)&local_598);
  }
  local_568 = "x structlist 1";
  pCVar16 = (CapTableReader *)0x0;
  ListReader::getStructElement(&local_598,(ListReader *)local_608,0);
  if (local_598.pointerCount == 0) {
    local_5b0 = 0x7fffffff;
    local_5c8._16_8_ = (WirePointer *)0x0;
    local_5c8._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_5c8._16_8_ = CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
    local_5c8._0_8_ = local_598.segment;
    pCVar16 = local_598.capTable;
    local_5b0 = local_598.nestingLimit;
  }
  local_5c8._8_8_ = pCVar16;
  local_560._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5c8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5c8,
             (DebugExpression<char_const(&)[15]> *)&local_568,(Reader *)&local_560);
  if ((local_5a0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    pCVar16 = (CapTableReader *)0x0;
    ListReader::getStructElement(&local_598,(ListReader *)local_608,0);
    if (local_598.pointerCount == 0) {
      local_560.nestingLimit = 0x7fffffff;
      local_560.pointer = (WirePointer *)0x0;
      local_560.segment = (SegmentReader *)0x0;
    }
    else {
      local_560.pointer = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
      local_560.segment = local_598.segment;
      pCVar16 = local_598.capTable;
      local_560.nestingLimit = local_598.nestingLimit;
    }
    local_560.capTable = pCVar16;
    local_560._0_16_ = PointerReader::getBlob<capnp::Text>(&local_560,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x112,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"x structlist 1\", listReader[0].getTextField()"
               ,(char (*) [70])
                "failed: expected (\"x structlist 1\") == (listReader[0].getTextField())",
               (DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5c8,
               (char (*) [15])"x structlist 1",(Reader *)&local_560);
  }
  local_568 = "x structlist 2";
  ListReader::getStructElement(&local_598,(ListReader *)local_608,1);
  if (local_598.pointerCount == 0) {
    local_5b0 = 0x7fffffff;
    local_5c8._8_8_ = (CapTableReader *)0x0;
    local_5c8._16_8_ = (WirePointer *)0x0;
    local_5c8._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_5c8._16_8_ = CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
    local_5c8._8_8_ = local_598.capTable;
    local_5c8._0_8_ = local_598.segment;
    local_5b0 = local_598.nestingLimit;
  }
  local_560._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5c8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5c8,
             (DebugExpression<char_const(&)[15]> *)&local_568,(Reader *)&local_560);
  if ((local_5a0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement(&local_598,(ListReader *)local_608,1);
    if (local_598.pointerCount == 0) {
      local_560.nestingLimit = 0x7fffffff;
      local_560.capTable = (CapTableReader *)0x0;
      local_560.pointer = (WirePointer *)0x0;
      local_560.segment = (SegmentReader *)0x0;
    }
    else {
      local_560.pointer = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
      local_560.capTable = local_598.capTable;
      local_560.segment = local_598.segment;
      local_560.nestingLimit = local_598.nestingLimit;
    }
    local_560._0_16_ = PointerReader::getBlob<capnp::Text>(&local_560,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x113,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"x structlist 2\", listReader[1].getTextField()"
               ,(char (*) [70])
                "failed: expected (\"x structlist 2\") == (listReader[1].getTextField())",
               (DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5c8,
               (char (*) [15])"x structlist 2",(Reader *)&local_560);
  }
  local_568 = "x structlist 3";
  ListReader::getStructElement(&local_598,(ListReader *)local_608,2);
  if (local_598.pointerCount == 0) {
    local_5b0 = 0x7fffffff;
    local_5c8._8_8_ = (CapTableReader *)0x0;
    local_5c8._16_8_ = (WirePointer *)0x0;
    local_5c8._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_5c8._16_8_ = CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
    local_5c8._8_8_ = local_598.capTable;
    local_5c8._0_8_ = local_598.segment;
    local_5b0 = local_598.nestingLimit;
  }
  local_560._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_5c8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5c8,
             (DebugExpression<char_const(&)[15]> *)&local_568,(Reader *)&local_560);
  if ((local_5a0._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement(&local_598,(ListReader *)local_608,2);
    if (local_598.pointerCount == 0) {
      local_598.nestingLimit = 0x7fffffff;
      local_560.capTable = (CapTableReader *)0x0;
      local_560.pointer = (WirePointer *)0x0;
      local_560.segment = (SegmentReader *)0x0;
    }
    else {
      local_560.pointer = (WirePointer *)CONCAT44(local_598.pointers._4_4_,(int)local_598.pointers);
      local_560.capTable = local_598.capTable;
      local_560.segment = local_598.segment;
    }
    local_560.nestingLimit = local_598.nestingLimit;
    local_560._0_16_ = PointerReader::getBlob<capnp::Text>(&local_560,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x114,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"x structlist 3\", listReader[2].getTextField()"
               ,(char (*) [70])
                "failed: expected (\"x structlist 3\") == (listReader[2].getTextField())",
               (DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)local_5c8,
               (char (*) [15])"x structlist 3",(Reader *)&local_560);
  }
  if (local_614 < 0x13) {
    uStack_5f0._0_4_ = 0x7fffffff;
    WStack_600 = (WirePointer)0x0;
    local_5f8 = (undefined1  [8])0x0;
    _local_608 = (char *)0x0;
  }
  else {
    local_5f8 = (undefined1  [8])(local_620 + 0x12);
    WStack_600 = local_630;
    _local_608 = (char *)local_638;
    uStack_5f0._0_4_ = local_610;
  }
  sVar12 = 0;
  PointerReader::getList(&local_300,(PointerReader *)local_608,TWO_BYTES,(word *)0x0);
  _local_608 = (char *)CONCAT26(uStack_604._2_2_,0x600010003);
  reader_14.reader.capTable = local_300.capTable;
  reader_14.reader.segment = local_300.segment;
  reader_14.reader.ptr = local_300.ptr;
  reader_14.reader.elementCount = local_300.elementCount;
  reader_14.reader.step = local_300.step;
  reader_14.reader.structDataSize = local_300.structDataSize;
  reader_14.reader.structPointerCount = local_300.structPointerCount;
  reader_14.reader.elementSize = local_300.elementSize;
  reader_14.reader._39_1_ = local_300._39_1_;
  reader_14.reader.nestingLimit = local_300.nestingLimit;
  reader_14.reader._44_4_ = local_300._44_4_;
  expected_13._M_len = 3;
  expected_13._M_array = (iterator)local_608;
  checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Reader,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>_>
            (reader_14,expected_13);
  if (0x12f < in_stack_00000028) {
    sVar12 = *(short *)(in_stack_00000018 + 0x24);
  }
  _local_608 = (float)CONCAT22(sVar12,5);
  WStack_600 = (WirePointer)0x299598;
  uStack_5f0._0_1_ = sVar12 == 5;
  local_5f8 = (undefined1  [8])&DAT_00000005;
  if ((sVar12 != 5) && (kj::_::Debug::minSeverity < 3)) {
    local_638._0_2_ = 5;
    if (in_stack_00000028 < 0x130) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined2 *)(in_stack_00000018 + 0x24);
    }
    local_5c8._0_2_ = uVar7;
    kj::_::Debug::
    log<char_const(&)[62],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x118,ERROR,
               "\"failed: expected \" \"(TestEnum::CORGE) == (reader.getEnumField())\", _kjCondition, TestEnum::CORGE, reader.getEnumField()"
               ,(char (*) [62])"failed: expected (TestEnum::CORGE) == (reader.getEnumField())",
               (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                *)local_608,(TestEnum_9c8e9318b29d9cd3 *)local_638,
               (TestEnum_9c8e9318b29d9cd3 *)local_5c8);
  }
  if (in_stack_0000002c < 4) {
    iVar13 = 0x7fffffff;
    local_630 = (WirePointer)0x0;
    local_628 = (WirePointer *)0x0;
    local_638 = (undefined1  [8])0x0;
  }
  else {
    local_628 = in_stack_00000020 + 3;
    local_630 = (WirePointer)in_stack_00000010;
    local_638 = (undefined1  [8])in_stack_00000008;
    iVar13 = (int)subReader._reader.segment;
  }
  local_620._0_4_ = iVar13;
  PointerReader::getList((ListReader *)local_608,(PointerReader *)local_638,VOID,(word *)0x0);
  local_5c8._4_4_ = (ListElementCount)uStack_5f0;
  local_5c8._0_4_ = 6;
  local_5c8._8_8_ = " == ";
  local_5c8._16_8_ = &DAT_00000005;
  local_5b0 = CONCAT31(local_5b0._1_3_,(ListElementCount)uStack_5f0 == 6);
  if (((ListElementCount)uStack_5f0 != 6) && (kj::_::Debug::minSeverity < 3)) {
    local_598.segment._0_4_ = 6;
    if (in_stack_0000002c < 4) {
      local_620._0_4_ = 0x7fffffff;
      local_630 = (WirePointer)0x0;
      local_628 = (WirePointer *)0x0;
      local_638 = (undefined1  [8])0x0;
    }
    else {
      local_628 = in_stack_00000020 + 3;
      local_630 = (WirePointer)in_stack_00000010;
      local_638 = (undefined1  [8])in_stack_00000008;
      local_620._0_4_ = (int)subReader._reader.segment;
    }
    PointerReader::getList((ListReader *)local_608,(PointerReader *)local_638,VOID,(word *)0x0);
    local_638._0_4_ = (ListElementCount)uStack_5f0;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x11a,ERROR,
               "\"failed: expected \" \"(6u) == (reader.getVoidList().size())\", _kjCondition, 6u, reader.getVoidList().size()"
               ,(char (*) [55])"failed: expected (6u) == (reader.getVoidList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_5c8,(uint *)&local_598,
               (uint *)local_638);
  }
  if (in_stack_0000002c < 5) {
    WStack_600 = (WirePointer)0x0;
    local_5f8 = (undefined1  [8])0x0;
    _local_608 = (char *)0x0;
    uStack_5f0._0_4_ = 0x7fffffff;
  }
  else {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 4);
    WStack_600 = (WirePointer)in_stack_00000010;
    _local_608 = (char *)in_stack_00000008;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_330,(PointerReader *)local_608,BIT,(word *)0x0);
  _local_608 = (char *)CONCAT44(uStack_604,0x1000001);
  reader_15.reader.capTable = local_330.capTable;
  reader_15.reader.segment = local_330.segment;
  reader_15.reader.ptr = local_330.ptr;
  reader_15.reader.elementCount = local_330.elementCount;
  reader_15.reader.step = local_330.step;
  reader_15.reader.structDataSize = local_330.structDataSize;
  reader_15.reader.structPointerCount = local_330.structPointerCount;
  reader_15.reader.elementSize = local_330.elementSize;
  reader_15.reader._39_1_ = local_330._39_1_;
  reader_15.reader.nestingLimit = local_330.nestingLimit;
  reader_15.reader._44_4_ = local_330._44_4_;
  expected_14._M_len = 4;
  expected_14._M_array = (iterator)local_608;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Reader,_capnp::List<bool,_(capnp::Kind)0>_>
            (reader_15,expected_14);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (5 < in_stack_0000002c) {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 5);
    _local_608 = (char *)in_stack_00000008;
    WStack_600 = (WirePointer)in_stack_00000010;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_360,(PointerReader *)local_608,BYTE,(word *)0x0);
  _local_608 = (char *)CONCAT62(_uStack_606,0x916f);
  reader_16.reader.capTable = local_360.capTable;
  reader_16.reader.segment = local_360.segment;
  reader_16.reader.ptr = local_360.ptr;
  reader_16.reader.elementCount = local_360.elementCount;
  reader_16.reader.step = local_360.step;
  reader_16.reader.structDataSize = local_360.structDataSize;
  reader_16.reader.structPointerCount = local_360.structPointerCount;
  reader_16.reader.elementSize = local_360.elementSize;
  reader_16.reader._39_1_ = local_360._39_1_;
  reader_16.reader.nestingLimit = local_360.nestingLimit;
  reader_16.reader._44_4_ = local_360._44_4_;
  expected_15._M_len = 2;
  expected_15._M_array = local_608;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Reader,_capnp::List<signed_char,_(capnp::Kind)0>_>
            (reader_16,expected_15);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (6 < in_stack_0000002c) {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 6);
    _local_608 = (char *)in_stack_00000008;
    WStack_600 = (WirePointer)in_stack_00000010;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_390,(PointerReader *)local_608,TWO_BYTES,(word *)0x0);
  _local_608 = (char *)CONCAT44(uStack_604,0xd4992b67);
  reader_17.reader.capTable = local_390.capTable;
  reader_17.reader.segment = local_390.segment;
  reader_17.reader.ptr = local_390.ptr;
  reader_17.reader.elementCount = local_390.elementCount;
  reader_17.reader.step = local_390.step;
  reader_17.reader.structDataSize = local_390.structDataSize;
  reader_17.reader.structPointerCount = local_390.structPointerCount;
  reader_17.reader.elementSize = local_390.elementSize;
  reader_17.reader._39_1_ = local_390._39_1_;
  reader_17.reader.nestingLimit = local_390.nestingLimit;
  reader_17.reader._44_4_ = local_390._44_4_;
  expected_16._M_len = 2;
  expected_16._M_array = (iterator)local_608;
  checkList<capnp::List<short,_(capnp::Kind)0>::Reader,_capnp::List<short,_(capnp::Kind)0>_>
            (reader_17,expected_16);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (7 < in_stack_0000002c) {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 7);
    _local_608 = (char *)in_stack_00000008;
    WStack_600 = (WirePointer)in_stack_00000010;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_3c0,(PointerReader *)local_608,FOUR_BYTES,(word *)0x0);
  _local_608 = (char *)0xf9609439069f6bc7;
  reader_18.reader.capTable = local_3c0.capTable;
  reader_18.reader.segment = local_3c0.segment;
  reader_18.reader.ptr = local_3c0.ptr;
  reader_18.reader.elementCount = local_3c0.elementCount;
  reader_18.reader.step = local_3c0.step;
  reader_18.reader.structDataSize = local_3c0.structDataSize;
  reader_18.reader.structPointerCount = local_3c0.structPointerCount;
  reader_18.reader.elementSize = local_3c0.elementSize;
  reader_18.reader._39_1_ = local_3c0._39_1_;
  reader_18.reader.nestingLimit = local_3c0.nestingLimit;
  reader_18.reader._44_4_ = local_3c0._44_4_;
  expected_17._M_len = 2;
  expected_17._M_array = (iterator)local_608;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_18,expected_17);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (8 < in_stack_0000002c) {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 8);
    _local_608 = (char *)in_stack_00000008;
    WStack_600 = (WirePointer)in_stack_00000010;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_3f0,(PointerReader *)local_608,EIGHT_BYTES,(word *)0x0);
  _local_608 = (char *)0xf6b75ab2bc471c7;
  WStack_600 = (WirePointer)0xf0948a54d43b8e39;
  reader_19.reader.capTable = local_3f0.capTable;
  reader_19.reader.segment = local_3f0.segment;
  reader_19.reader.ptr = local_3f0.ptr;
  reader_19.reader.elementCount = local_3f0.elementCount;
  reader_19.reader.step = local_3f0.step;
  reader_19.reader.structDataSize = local_3f0.structDataSize;
  reader_19.reader.structPointerCount = local_3f0.structPointerCount;
  reader_19.reader.elementSize = local_3f0.elementSize;
  reader_19.reader._39_1_ = local_3f0._39_1_;
  reader_19.reader.nestingLimit = local_3f0.nestingLimit;
  reader_19.reader._44_4_ = local_3f0._44_4_;
  expected_18._M_len = 2;
  expected_18._M_array = (iterator)local_608;
  checkList<capnp::List<long,_(capnp::Kind)0>::Reader,_capnp::List<long,_(capnp::Kind)0>_>
            (reader_19,expected_18);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (9 < in_stack_0000002c) {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 9);
    _local_608 = (char *)in_stack_00000008;
    WStack_600 = (WirePointer)in_stack_00000010;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_420,(PointerReader *)local_608,BYTE,(word *)0x0);
  _local_608 = (char *)CONCAT62(_uStack_606,0xde6f);
  reader_20.reader.capTable = local_420.capTable;
  reader_20.reader.segment = local_420.segment;
  reader_20.reader.ptr = local_420.ptr;
  reader_20.reader.elementCount = local_420.elementCount;
  reader_20.reader.step = local_420.step;
  reader_20.reader.structDataSize = local_420.structDataSize;
  reader_20.reader.structPointerCount = local_420.structPointerCount;
  reader_20.reader.elementSize = local_420.elementSize;
  reader_20.reader._39_1_ = local_420._39_1_;
  reader_20.reader.nestingLimit = local_420.nestingLimit;
  reader_20.reader._44_4_ = local_420._44_4_;
  expected_19._M_len = 2;
  expected_19._M_array = local_608;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_20,expected_19);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (10 < in_stack_0000002c) {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 10);
    _local_608 = (char *)in_stack_00000008;
    WStack_600 = (WirePointer)in_stack_00000010;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_450,(PointerReader *)local_608,TWO_BYTES,(word *)0x0);
  _local_608 = (char *)CONCAT44(uStack_604,0xad9c8235);
  reader_21.reader.capTable = local_450.capTable;
  reader_21.reader.segment = local_450.segment;
  reader_21.reader.ptr = local_450.ptr;
  reader_21.reader.elementCount = local_450.elementCount;
  reader_21.reader.step = local_450.step;
  reader_21.reader.structDataSize = local_450.structDataSize;
  reader_21.reader.structPointerCount = local_450.structPointerCount;
  reader_21.reader.elementSize = local_450.elementSize;
  reader_21.reader._39_1_ = local_450._39_1_;
  reader_21.reader.nestingLimit = local_450.nestingLimit;
  reader_21.reader._44_4_ = local_450._44_4_;
  expected_20._M_len = 2;
  expected_20._M_array = (iterator)local_608;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_21,expected_20);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (0xb < in_stack_0000002c) {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 0xb);
    _local_608 = (char *)in_stack_00000008;
    WStack_600 = (WirePointer)in_stack_00000010;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_480,(PointerReader *)local_608,FOUR_BYTES,(word *)0x0);
  _local_608 = (char *)CONCAT44(uStack_604,0xc6aea155);
  reader_22.reader.capTable = local_480.capTable;
  reader_22.reader.segment = local_480.segment;
  reader_22.reader.ptr = local_480.ptr;
  reader_22.reader.elementCount = local_480.elementCount;
  reader_22.reader.step = local_480.step;
  reader_22.reader.structDataSize = local_480.structDataSize;
  reader_22.reader.structPointerCount = local_480.structPointerCount;
  reader_22.reader.elementSize = local_480.elementSize;
  reader_22.reader._39_1_ = local_480._39_1_;
  reader_22.reader.nestingLimit = local_480.nestingLimit;
  reader_22.reader._44_4_ = local_480._44_4_;
  expected_21._M_len = 1;
  expected_21._M_array = (iterator)local_608;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader_22,expected_21);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  uStack_5f0._0_4_ = 0x7fffffff;
  if (0xc < in_stack_0000002c) {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 0xc);
    _local_608 = (char *)in_stack_00000008;
    WStack_600 = (WirePointer)in_stack_00000010;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_4b0,(PointerReader *)local_608,EIGHT_BYTES,(word *)0x0);
  _local_608 = (char *)0x9a3298afb5ac71c7;
  reader_23.reader.capTable = local_4b0.capTable;
  reader_23.reader.segment = local_4b0.segment;
  reader_23.reader.ptr = local_4b0.ptr;
  reader_23.reader.elementCount = local_4b0.elementCount;
  reader_23.reader.step = local_4b0.step;
  reader_23.reader.structDataSize = local_4b0.structDataSize;
  reader_23.reader.structPointerCount = local_4b0.structPointerCount;
  reader_23.reader.elementSize = local_4b0.elementSize;
  reader_23.reader._39_1_ = local_4b0._39_1_;
  reader_23.reader.nestingLimit = local_4b0.nestingLimit;
  reader_23.reader._44_4_ = local_4b0._44_4_;
  expected_22._M_len = 1;
  expected_22._M_array = (iterator)local_608;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_long,_(capnp::Kind)0>_>
            (reader_23,expected_22);
  local_628 = (WirePointer *)0x0;
  local_638 = (undefined1  [8])(SegmentReader *)0x0;
  local_630 = (WirePointer)(CapTableReader *)0x0;
  iVar13 = 0x7fffffff;
  if (0xd < in_stack_0000002c) {
    local_628 = in_stack_00000020 + 0xd;
    local_638 = (undefined1  [8])in_stack_00000008;
    local_630 = (WirePointer)in_stack_00000010;
    iVar13 = (int)subReader._reader.segment;
  }
  local_620 = (WirePointer *)CONCAT44(local_620._4_4_,iVar13);
  PointerReader::getList((ListReader *)local_608,(PointerReader *)local_638,FOUR_BYTES,(word *)0x0);
  local_638._4_4_ = (ListElementCount)uStack_5f0;
  local_638._0_4_ = 4;
  local_630 = (WirePointer)" == ";
  local_628 = (WirePointer *)&DAT_00000005;
  local_620 = (WirePointer *)CONCAT71(local_620._1_7_,(ListElementCount)uStack_5f0 == 4);
  if ((ListElementCount)uStack_5f0 != 4) {
    local_598.segment._0_4_ = 4;
    local_560.segment._0_4_ = (ListElementCount)uStack_5f0;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x126,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_638,(uint *)&local_598,
               (uint *)&local_560);
    kj::_::Debug::Fault::fatal((Fault *)local_5c8);
  }
  local_638._4_4_ = ((WireValue<uint32_t> *)local_5f8)->value;
  local_620._0_1_ = (float)local_638._4_4_ == 5555.5;
  local_638._0_4_ = 0x45ad9c00;
  local_630 = (WirePointer)" == ";
  local_628 = (WirePointer *)&DAT_00000005;
  if ((((float)local_638._4_4_ != 5555.5) || (NAN((float)local_638._4_4_))) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_4_ = 0x45ad9c00;
    local_598.segment._0_4_ = ((WireValue<uint32_t> *)local_5f8)->value;
    kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<float,float>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x127,ERROR,
               "\"failed: expected \" \"(5555.5f) == (listReader[0])\", _kjCondition, 5555.5f, listReader[0]"
               ,(char (*) [46])"failed: expected (5555.5f) == (listReader[0])",
               (DebugComparison<float,_float> *)local_638,(float *)local_5c8,(float *)&local_598);
  }
  local_638._4_4_ =
       *(float *)((long)&((WireValue<uint32_t> *)local_5f8)->value + (ulong)(uStack_5f0._4_4_ >> 3))
  ;
  local_620._0_1_ = INFINITY <= (float)local_638._4_4_;
  local_638._0_4_ = 0x7f800000;
  local_630 = (WirePointer)" == ";
  local_628 = (WirePointer *)&DAT_00000005;
  if ((!local_620._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_4_ = 0x7f800000;
    local_598.segment._0_4_ =
         *(undefined4 *)
          ((long)&((WireValue<uint32_t> *)local_5f8)->value + (ulong)(uStack_5f0._4_4_ >> 3));
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,float>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x128,ERROR,
               "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
               ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
               (DebugComparison<float,_float> *)local_638,(float *)local_5c8,(float *)&local_598);
  }
  local_638._4_4_ =
       *(float *)((long)&((WireValue<uint32_t> *)local_5f8)->value + (ulong)(uStack_5f0._4_4_ >> 2))
  ;
  local_638._0_4_ = 0xff800000;
  local_630 = (WirePointer)" == ";
  local_628 = (WirePointer *)&DAT_00000005;
  local_620 = (WirePointer *)CONCAT71(local_620._1_7_,(float)local_638._4_4_ <= -INFINITY);
  if (((float)local_638._4_4_ > -INFINITY) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_4_ = 0xff800000;
    local_598.segment._0_4_ =
         *(undefined4 *)
          ((long)&((WireValue<uint32_t> *)local_5f8)->value + (ulong)(uStack_5f0._4_4_ >> 2));
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,float>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x129,ERROR,
               "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
               ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
               (DebugComparison<float,_float> *)local_638,(float *)local_5c8,(float *)&local_598);
  }
  bVar17 = NAN(*(float *)((long)&((WireValue<uint32_t> *)local_5f8)->value +
                         ((ulong)uStack_5f0._4_4_ * 3 >> 3)));
  local_638[0] = bVar17;
  if ((!bVar17) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x12a,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
               (char (*) [38])"failed: expected isNaN(listReader[3])",
               (DebugExpression<bool> *)local_638);
  }
  if (in_stack_0000002c < 0xf) {
    iVar13 = 0x7fffffff;
    local_630 = (WirePointer)0x0;
    local_628 = (WirePointer *)0x0;
    local_638 = (undefined1  [8])0x0;
  }
  else {
    local_628 = in_stack_00000020 + 0xe;
    local_630 = (WirePointer)in_stack_00000010;
    local_638 = (undefined1  [8])in_stack_00000008;
    iVar13 = (int)subReader._reader.segment;
  }
  local_620 = (WirePointer *)CONCAT44(local_620._4_4_,iVar13);
  PointerReader::getList((ListReader *)local_608,(PointerReader *)local_638,EIGHT_BYTES,(word *)0x0)
  ;
  local_638._4_4_ = (ListElementCount)uStack_5f0;
  local_638._0_4_ = 4;
  local_630 = (WirePointer)" == ";
  local_628 = (WirePointer *)&DAT_00000005;
  local_620 = (WirePointer *)CONCAT71(local_620._1_7_,(ListElementCount)uStack_5f0 == 4);
  if ((ListElementCount)uStack_5f0 != 4) {
    local_598.segment._0_4_ = 4;
    local_560.segment._0_4_ = (ListElementCount)uStack_5f0;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x12e,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_638,(uint *)&local_598,
               (uint *)&local_560);
    kj::_::Debug::Fault::fatal((Fault *)local_5c8);
  }
  WVar9 = *(WirePointer *)local_5f8;
  local_630.offsetAndKind.value = WVar9.offsetAndKind.value;
  local_630.field_1 = WVar9.field_1;
  local_638 = (undefined1  [8])0x40be61c000000000;
  local_628 = (WirePointer *)0x299598;
  local_620 = (WirePointer *)&DAT_00000005;
  if ((((double)WVar9 != 7777.75) || (NAN((double)WVar9))) && (kj::_::Debug::minSeverity < 3)) {
    local_5c8._0_8_ = (char *)0x40be61c000000000;
    local_598.segment = (SegmentReader *)*(WirePointer *)local_5f8;
    local_618._0_1_ = (double)WVar9 == 7777.75;
    kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x12f,ERROR,
               "\"failed: expected \" \"(7777.75) == (listReader[0])\", _kjCondition, 7777.75, listReader[0]"
               ,(char (*) [46])"failed: expected (7777.75) == (listReader[0])",
               (DebugComparison<double,_double> *)local_638,(double *)local_5c8,(double *)&local_598
              );
  }
  dVar26 = *(double *)
            ((long)&((WireValue<uint32_t> *)local_5f8)->value + (ulong)(uStack_5f0._4_4_ >> 3));
  local_618._0_1_ = INFINITY <= dVar26;
  local_638._0_4_ = 0x7f800000;
  local_630 = (WirePointer)dVar26;
  local_628 = (WirePointer *)0x299598;
  local_620 = (WirePointer *)&DAT_00000005;
  if ((!local_618._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    local_598.segment._0_4_ = 0x7f800000;
    local_5c8._0_8_ =
         *(char **)((long)&((WireValue<uint32_t> *)local_5f8)->value +
                   (ulong)(uStack_5f0._4_4_ >> 3));
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,double>&,float,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x130,ERROR,
               "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
               ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
               (DebugComparison<float,_double> *)local_638,(float *)&local_598,(double *)local_5c8);
  }
  dVar26 = *(double *)
            ((long)&((WireValue<uint32_t> *)local_5f8)->value + (ulong)(uStack_5f0._4_4_ >> 2));
  local_638._0_4_ = 0xff800000;
  local_630 = (WirePointer)dVar26;
  local_628 = (WirePointer *)0x299598;
  local_620 = (WirePointer *)&DAT_00000005;
  local_618 = CONCAT31(local_618._1_3_,dVar26 <= -INFINITY);
  if ((dVar26 > -INFINITY) && (kj::_::Debug::minSeverity < 3)) {
    local_598.segment._0_4_ = 0xff800000;
    local_5c8._0_8_ =
         *(char **)((long)&((WireValue<uint32_t> *)local_5f8)->value +
                   (ulong)(uStack_5f0._4_4_ >> 2));
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,double>&,float,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x131,ERROR,
               "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
               ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
               (DebugComparison<float,_double> *)local_638,(float *)&local_598,(double *)local_5c8);
  }
  bVar17 = NAN(*(double *)
                ((long)&((WireValue<uint32_t> *)local_5f8)->value +
                ((ulong)uStack_5f0._4_4_ * 3 >> 3)));
  local_638[0] = bVar17;
  if ((!bVar17) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x132,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
               (char (*) [38])"failed: expected isNaN(listReader[3])",
               (DebugExpression<bool> *)local_638);
  }
  if (in_stack_0000002c < 0x10) {
    WStack_600 = (WirePointer)0x0;
    local_5f8 = (undefined1  [8])0x0;
    _local_608 = (char *)0x0;
    uStack_5f0._0_4_ = 0x7fffffff;
  }
  else {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 0xf);
    WStack_600 = (WirePointer)in_stack_00000010;
    _local_608 = (char *)in_stack_00000008;
    uStack_5f0._0_4_ = (int)subReader._reader.segment;
  }
  PointerReader::getList(&local_4e0,(PointerReader *)local_608,POINTER,(word *)0x0);
  _local_608 = "plugh";
  WStack_600 = (WirePointer)0x6;
  local_5f8 = (undefined1  [8])0x29fd3f;
  uStack_5f0 = (WirePointer *)0x6;
  local_5e8 = "thud";
  sStack_5e0 = 5;
  reader_24.reader.capTable = local_4e0.capTable;
  reader_24.reader.segment = local_4e0.segment;
  reader_24.reader.ptr = local_4e0.ptr;
  reader_24.reader.elementCount = local_4e0.elementCount;
  reader_24.reader.step = local_4e0.step;
  reader_24.reader.structDataSize = local_4e0.structDataSize;
  reader_24.reader.structPointerCount = local_4e0.structPointerCount;
  reader_24.reader.elementSize = local_4e0.elementSize;
  reader_24.reader._39_1_ = local_4e0._39_1_;
  reader_24.reader.nestingLimit = local_4e0.nestingLimit;
  reader_24.reader._44_4_ = local_4e0._44_4_;
  expected_23._M_len = 3;
  expected_23._M_array = (iterator)local_608;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Text,_(capnp::Kind)1>_>
            (reader_24,expected_23);
  local_5f8 = (undefined1  [8])0x0;
  _local_608 = (char *)(SegmentReader *)0x0;
  WStack_600 = (WirePointer)(CapTableReader *)0x0;
  iVar13 = 0x7fffffff;
  if (0x10 < in_stack_0000002c) {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 0x10);
    _local_608 = (char *)in_stack_00000008;
    WStack_600 = (WirePointer)in_stack_00000010;
    iVar13 = (int)subReader._reader.segment;
  }
  uStack_5f0._0_4_ = iVar13;
  PointerReader::getList(&local_510,(PointerReader *)local_608,POINTER,(word *)0x0);
  _local_608 = "oops";
  WStack_600 = (WirePointer)&DAT_00000004;
  uStack_5f0 = (WirePointer *)0x9;
  local_5f8 = (undefined1  [8])anon_var_dwarf_ba5c8;
  local_5e8 = "rfc3092";
  sStack_5e0 = 7;
  reader_25.reader.capTable = local_510.capTable;
  reader_25.reader.segment = local_510.segment;
  reader_25.reader.ptr = local_510.ptr;
  reader_25.reader.elementCount = local_510.elementCount;
  reader_25.reader.step = local_510.step;
  reader_25.reader.structDataSize = local_510.structDataSize;
  reader_25.reader.structPointerCount = local_510.structPointerCount;
  reader_25.reader.elementSize = local_510.elementSize;
  reader_25.reader._39_1_ = local_510._39_1_;
  reader_25.reader.nestingLimit = local_510.nestingLimit;
  reader_25.reader._44_4_ = local_510._44_4_;
  expected_24._M_len = 3;
  expected_24._M_array = (iterator)local_608;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Reader,_capnp::List<capnp::Data,_(capnp::Kind)1>_>
            (reader_25,expected_24);
  local_628 = (WirePointer *)0x0;
  local_638 = (undefined1  [8])(SegmentReader *)0x0;
  local_630 = (WirePointer)(CapTableReader *)0x0;
  iVar13 = 0x7fffffff;
  if (0x11 < in_stack_0000002c) {
    local_628 = in_stack_00000020 + 0x11;
    local_638 = (undefined1  [8])in_stack_00000008;
    local_630 = (WirePointer)in_stack_00000010;
    iVar13 = (int)subReader._reader.segment;
  }
  local_620 = (WirePointer *)CONCAT44(local_620._4_4_,iVar13);
  PointerReader::getList
            ((ListReader *)local_608,(PointerReader *)local_638,INLINE_COMPOSITE,(word *)0x0);
  local_638._4_4_ = (ListElementCount)uStack_5f0;
  local_638._0_4_ = 3;
  local_630 = (WirePointer)0x299598;
  local_628 = (WirePointer *)&DAT_00000005;
  local_620 = (WirePointer *)CONCAT71(local_620._1_7_,(ListElementCount)uStack_5f0 == 3);
  if ((ListElementCount)uStack_5f0 != 3) {
    local_598.segment._0_4_ = 3;
    local_560.segment._0_4_ = (ListElementCount)uStack_5f0;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x138,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_638,(uint *)&local_598,
               (uint *)&local_560);
    kj::_::Debug::Fault::fatal((Fault *)local_5c8);
  }
  local_560.segment = (SegmentReader *)0x2b08da;
  pCVar16 = (CapTableReader *)0x0;
  ListReader::getStructElement((StructReader *)local_5c8,(ListReader *)local_608,0);
  if (local_5a4 == 0) {
    iVar13 = 0x7fffffff;
    local_628 = (WirePointer *)0x0;
    local_638 = (undefined1  [8])0x0;
  }
  else {
    local_628 = (WirePointer *)CONCAT44(uStack_5ac,local_5b0);
    local_638 = (undefined1  [8])local_5c8._0_8_;
    pCVar16 = (CapTableReader *)local_5c8._8_8_;
    iVar13 = local_5a0;
  }
  local_630 = (WirePointer)pCVar16;
  local_620 = (WirePointer *)CONCAT44(local_620._4_4_,iVar13);
  local_598._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_638,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[13]>::operator==
            ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_638,
             (DebugExpression<char_const(&)[13]> *)&local_560,(Reader *)&local_598);
  if ((local_610._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    pCVar16 = (CapTableReader *)0x0;
    ListReader::getStructElement((StructReader *)local_5c8,(ListReader *)local_608,0);
    if (local_5a4 == 0) {
      local_598.pointers._0_4_ = 0x7fffffff;
      local_598.data = (WirePointer *)0x0;
      local_598.segment = (SegmentReader *)0x0;
    }
    else {
      local_598.data = (void *)CONCAT44(uStack_5ac,local_5b0);
      local_598.segment = (SegmentReader *)local_5c8._0_8_;
      pCVar16 = (CapTableReader *)local_5c8._8_8_;
      local_598.pointers._0_4_ = local_5a0;
    }
    local_598.capTable = pCVar16;
    local_598._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_598,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x139,ERROR,
               "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"structlist 1\", listReader[0].getTextField()"
               ,(char (*) [68])
                "failed: expected (\"structlist 1\") == (listReader[0].getTextField())",
               (DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_638,
               (char (*) [13])0x2b08da,(Reader *)&local_598);
  }
  local_560.segment = (SegmentReader *)0x2a0cc8;
  ListReader::getStructElement((StructReader *)local_5c8,(ListReader *)local_608,1);
  if (local_5a4 == 0) {
    iVar13 = 0x7fffffff;
    local_630 = (WirePointer)0x0;
    local_628 = (WirePointer *)0x0;
    local_638 = (undefined1  [8])0x0;
  }
  else {
    local_628 = (WirePointer *)CONCAT44(uStack_5ac,local_5b0);
    local_630 = (WirePointer)local_5c8._8_8_;
    local_638 = (undefined1  [8])local_5c8._0_8_;
    iVar13 = local_5a0;
  }
  local_620 = (WirePointer *)CONCAT44(local_620._4_4_,iVar13);
  local_598._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_638,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[13]>::operator==
            ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_638,
             (DebugExpression<char_const(&)[13]> *)&local_560,(Reader *)&local_598);
  if ((local_610._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)local_5c8,(ListReader *)local_608,1);
    if (local_5a4 == 0) {
      local_598.pointers._0_4_ = 0x7fffffff;
      local_598.capTable = (CapTableReader *)0x0;
      local_598.data = (WirePointer *)0x0;
      local_598.segment = (SegmentReader *)0x0;
    }
    else {
      local_598.data = (void *)CONCAT44(uStack_5ac,local_5b0);
      local_598.capTable = (CapTableReader *)local_5c8._8_8_;
      local_598.segment = (SegmentReader *)local_5c8._0_8_;
      local_598.pointers._0_4_ = local_5a0;
    }
    local_598._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_598,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x13a,ERROR,
               "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"structlist 2\", listReader[1].getTextField()"
               ,(char (*) [68])
                "failed: expected (\"structlist 2\") == (listReader[1].getTextField())",
               (DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_638,
               (char (*) [13])0x2a0cc8,(Reader *)&local_598);
  }
  local_560.segment = (SegmentReader *)"structlist 3";
  ListReader::getStructElement((StructReader *)local_5c8,(ListReader *)local_608,2);
  if (local_5a4 == 0) {
    iVar13 = 0x7fffffff;
    local_630 = (WirePointer)0x0;
    local_628 = (WirePointer *)0x0;
    local_638 = (undefined1  [8])0x0;
  }
  else {
    local_628 = (WirePointer *)CONCAT44(uStack_5ac,local_5b0);
    local_630 = (WirePointer)local_5c8._8_8_;
    local_638 = (undefined1  [8])local_5c8._0_8_;
    iVar13 = local_5a0;
  }
  local_620 = (WirePointer *)CONCAT44(local_620._4_4_,iVar13);
  local_598._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)local_638,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[13]>::operator==
            ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_638,
             (DebugExpression<char_const(&)[13]> *)&local_560,(Reader *)&local_598);
  if ((local_610._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)local_5c8,(ListReader *)local_608,2);
    if (local_5a4 == 0) {
      local_5a0 = 0x7fffffff;
      local_598.capTable = (CapTableReader *)0x0;
      local_598.data = (WirePointer *)0x0;
      local_598.segment = (SegmentReader *)0x0;
    }
    else {
      local_598.data = (void *)CONCAT44(uStack_5ac,local_5b0);
      local_598.capTable = (CapTableReader *)local_5c8._8_8_;
      local_598.segment = (SegmentReader *)local_5c8._0_8_;
    }
    local_598.pointers._0_4_ = local_5a0;
    local_598._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_598,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x13b,ERROR,
               "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"structlist 3\", listReader[2].getTextField()"
               ,(char (*) [68])
                "failed: expected (\"structlist 3\") == (listReader[2].getTextField())",
               (DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)local_638,
               (char (*) [13])0x2b0a9a,(Reader *)&local_598);
  }
  if (in_stack_0000002c < 0x13) {
    subReader._reader.segment._0_4_ = 0x7fffffff;
    in_stack_00000010 = (CapTableReader *)0x0;
    local_5f8 = (undefined1  [8])0x0;
    in_stack_00000008 = (SegmentReader *)0x0;
  }
  else {
    local_5f8 = (undefined1  [8])(in_stack_00000020 + 0x12);
  }
  uStack_5f0._0_4_ = (int)subReader._reader.segment;
  _local_608 = (char *)in_stack_00000008;
  WStack_600 = (WirePointer)in_stack_00000010;
  PointerReader::getList(&local_540,(PointerReader *)local_608,TWO_BYTES,(word *)0x0);
  _local_608 = (char *)CONCAT44(uStack_604,0x70000);
  reader_26.reader.capTable = local_540.capTable;
  reader_26.reader.segment = local_540.segment;
  reader_26.reader.ptr = local_540.ptr;
  reader_26.reader.elementCount = local_540.elementCount;
  reader_26.reader.step = local_540.step;
  reader_26.reader.structDataSize = local_540.structDataSize;
  reader_26.reader.structPointerCount = local_540.structPointerCount;
  reader_26.reader.elementSize = local_540.elementSize;
  reader_26.reader._39_1_ = local_540._39_1_;
  reader_26.reader.nestingLimit = local_540.nestingLimit;
  reader_26.reader._44_4_ = local_540._44_4_;
  expected_25._M_len = 2;
  expected_25._M_array = (iterator)local_608;
  checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Reader,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>_>
            (reader_26,expected_25);
  return;
}

Assistant:

void genericCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(true, reader.getBoolField());
  EXPECT_EQ(-123, reader.getInt8Field());
  EXPECT_EQ(-12345, reader.getInt16Field());
  EXPECT_EQ(-12345678, reader.getInt32Field());
  EXPECT_EQ(-123456789012345ll, reader.getInt64Field());
  EXPECT_EQ(234u, reader.getUInt8Field());
  EXPECT_EQ(45678u, reader.getUInt16Field());
  EXPECT_EQ(3456789012u, reader.getUInt32Field());
  EXPECT_EQ(12345678901234567890ull, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(1234.5f, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(-123e45, reader.getFloat64Field());
  EXPECT_EQ("foo", reader.getTextField());
  EXPECT_EQ(data("bar"), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(true, subReader.getBoolField());
    EXPECT_EQ(-12, subReader.getInt8Field());
    EXPECT_EQ(3456, subReader.getInt16Field());
    EXPECT_EQ(-78901234, subReader.getInt32Field());
    EXPECT_EQ(56789012345678ll, subReader.getInt64Field());
    EXPECT_EQ(90u, subReader.getUInt8Field());
    EXPECT_EQ(1234u, subReader.getUInt16Field());
    EXPECT_EQ(56789012u, subReader.getUInt32Field());
    EXPECT_EQ(345678901234567890ull, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(345, subReader.getFloat64Field());
    EXPECT_EQ("baz", subReader.getTextField());
    EXPECT_EQ(data("qux"), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("nested", subSubReader.getTextField());
      EXPECT_EQ("really nested", subSubReader.getStructField().getTextField());
    }
    EXPECT_EQ(TestEnum::BAZ, subReader.getEnumField());

    checkList(subReader.getVoidList(), {VOID, VOID, VOID});
    checkList(subReader.getBoolList(), {false, true, false, true, true});
    checkList(subReader.getInt8List(), {12, -34, -0x80, 0x7f});
    checkList(subReader.getInt16List(), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList(subReader.getInt32List(), {12345678, -90123456, -0x7fffffff - 1, 0x7fffffff});
    checkList(subReader.getInt64List(), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList(subReader.getUInt8List(), {12u, 34u, 0u, 0xffu});
    checkList(subReader.getUInt16List(), {1234u, 5678u, 0u, 0xffffu});
    checkList(subReader.getUInt32List(), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList(subReader.getUInt64List(), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList(subReader.getFloat32List(), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList(subReader.getFloat64List(), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList(subReader.getTextList(), {"quux", "corge", "grault"});
    checkList(subReader.getDataList(), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.getStructList();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].getTextField());
      EXPECT_EQ("x structlist 2", listReader[1].getTextField());
      EXPECT_EQ("x structlist 3", listReader[2].getTextField());
    }
    checkList(subReader.getEnumList(), {TestEnum::QUX, TestEnum::BAR, TestEnum::GRAULT});
  }
  EXPECT_EQ(TestEnum::CORGE, reader.getEnumField());

  EXPECT_EQ(6u, reader.getVoidList().size());
  checkList(reader.getBoolList(), {true, false, false, true});
  checkList(reader.getInt8List(), {111, -111});
  checkList(reader.getInt16List(), {11111, -11111});
  checkList(reader.getInt32List(), {111111111, -111111111});
  checkList(reader.getInt64List(), {1111111111111111111ll, -1111111111111111111ll});
  checkList(reader.getUInt8List(), {111u, 222u});
  checkList(reader.getUInt16List(), {33333u, 44444u});
  checkList(reader.getUInt32List(), {3333333333u});
  checkList(reader.getUInt64List(), {11111111111111111111ull});
  {
    auto listReader = reader.getFloat32List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  {
    auto listReader = reader.getFloat64List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  checkList(reader.getTextList(), {"plugh", "xyzzy", "thud"});
  checkList(reader.getDataList(), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.getStructList();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].getTextField());
    EXPECT_EQ("structlist 2", listReader[1].getTextField());
    EXPECT_EQ("structlist 3", listReader[2].getTextField());
  }
  checkList(reader.getEnumList(), {TestEnum::FOO, TestEnum::GARPLY});
}